

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx512::CurveNiMBIntersectorK<4,16>::
     intersect_n<embree::avx512::OrientedCurve1IntersectorK<embree::BezierCurveT,16>,embree::avx512::Intersect1KEpilog1<16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  Primitive PVar6;
  uint uVar7;
  uint uVar8;
  Geometry *pGVar9;
  __int_type_conflict _Var10;
  long lVar11;
  long lVar12;
  long lVar13;
  RTCFilterFunctionN p_Var14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  byte bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [60];
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  byte bVar51;
  uint uVar52;
  ulong uVar53;
  long lVar55;
  long lVar56;
  uint uVar57;
  ulong uVar58;
  uint uVar59;
  uint uVar60;
  ulong uVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 in_ZmmResult [64];
  undefined1 auVar107 [64];
  undefined1 auVar109 [64];
  undefined1 auVar111 [64];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  undefined1 auVar115 [64];
  undefined1 auVar117 [64];
  undefined1 auVar119 [64];
  undefined1 auVar121 [64];
  undefined1 auVar123 [64];
  undefined1 auVar125 [64];
  undefined1 auVar126 [64];
  int iVar128;
  float fVar129;
  undefined4 uVar130;
  vint4 bi_2;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [64];
  vint4 bi_1;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [32];
  vint4 bi;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  vfloat4 a0;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  vint4 ai_2;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [32];
  vint4 ai_1;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  vint4 ai;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  float fVar209;
  float fVar226;
  float fVar227;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  float fVar228;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [32];
  float fVar233;
  float fVar245;
  float fVar246;
  vfloat4 a0_3;
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  float fVar247;
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  float fVar248;
  float fVar249;
  float fVar250;
  vfloat4 b0_2;
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  float fVar266;
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  vfloat4 a0_4;
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [64];
  undefined1 auVar285 [64];
  undefined1 in_ZMM19 [64];
  undefined1 in_ZMM22 [64];
  undefined1 auVar286 [64];
  undefined1 auVar287 [64];
  undefined1 auVar288 [64];
  int iVar289;
  undefined1 in_ZMM31 [64];
  undefined1 auVar290 [64];
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  vint<16> mask;
  BBox1f cv_stack [4];
  RTCFilterFunctionNArguments local_6c0;
  undefined1 local_690 [16];
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  undefined1 local_670 [8];
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  undefined1 local_650 [8];
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  undefined1 local_630 [16];
  undefined1 local_620 [16];
  undefined1 local_610 [16];
  undefined1 local_600 [16];
  uint auStack_5f0 [4];
  undefined1 local_5e0 [16];
  undefined1 local_5d0 [8];
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [16];
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [16];
  undefined1 local_590 [8];
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  undefined1 local_570 [8];
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  undefined1 local_550 [16];
  undefined1 local_540 [16];
  undefined1 local_530 [16];
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  undefined1 local_500 [16];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [16];
  undefined1 local_490 [16];
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  uint uStack_460;
  float afStack_45c [7];
  undefined1 local_440 [64];
  undefined1 local_3e0 [32];
  undefined4 local_3c0;
  undefined4 uStack_3bc;
  undefined4 uStack_3b8;
  undefined4 uStack_3b4;
  undefined4 uStack_3b0;
  undefined4 uStack_3ac;
  undefined4 uStack_3a8;
  undefined4 uStack_3a4;
  ulong auStack_3a0 [4];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  ulong uVar54;
  undefined1 auVar108 [64];
  undefined1 auVar110 [64];
  undefined1 auVar114 [64];
  undefined1 auVar116 [64];
  undefined1 auVar118 [64];
  undefined1 auVar120 [64];
  undefined1 auVar122 [64];
  undefined1 auVar124 [64];
  undefined1 auVar127 [48];
  
  PVar6 = prim[1];
  uVar53 = (ulong)(byte)PVar6;
  lVar56 = uVar53 * 0x25;
  fVar129 = *(float *)(prim + lVar56 + 0x12);
  auVar62 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar62 = vinsertps_avx(auVar62,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar63 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar63 = vinsertps_avx(auVar63,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar62 = vsubps_avx(auVar62,*(undefined1 (*) [16])(prim + lVar56 + 6));
  auVar153._0_4_ = fVar129 * auVar62._0_4_;
  auVar153._4_4_ = fVar129 * auVar62._4_4_;
  auVar153._8_4_ = fVar129 * auVar62._8_4_;
  auVar153._12_4_ = fVar129 * auVar62._12_4_;
  auVar62 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar53 * 4 + 6)));
  auVar66._0_4_ = fVar129 * auVar63._0_4_;
  auVar66._4_4_ = fVar129 * auVar63._4_4_;
  auVar66._8_4_ = fVar129 * auVar63._8_4_;
  auVar66._12_4_ = fVar129 * auVar63._12_4_;
  auVar62 = vcvtdq2ps_avx(auVar62);
  auVar63 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar53 * 5 + 6)));
  auVar63 = vcvtdq2ps_avx(auVar63);
  auVar64 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar53 * 6 + 6)));
  auVar71 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar53 * 0xf + 6)));
  auVar64 = vcvtdq2ps_avx(auVar64);
  auVar71 = vcvtdq2ps_avx(auVar71);
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + 6)));
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar74 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar53 + 6)));
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar75 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar53 * 0x1a + 6)));
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar76 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar53 * 0x1b + 6)));
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar53 * 0x1c + 6)));
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar172._4_4_ = auVar66._0_4_;
  auVar172._0_4_ = auVar66._0_4_;
  auVar172._8_4_ = auVar66._0_4_;
  auVar172._12_4_ = auVar66._0_4_;
  auVar80 = vshufps_avx(auVar66,auVar66,0x55);
  auVar81 = vshufps_avx(auVar66,auVar66,0xaa);
  fVar129 = auVar81._0_4_;
  auVar146._0_4_ = fVar129 * auVar64._0_4_;
  fVar250 = auVar81._4_4_;
  auVar146._4_4_ = fVar250 * auVar64._4_4_;
  fVar233 = auVar81._8_4_;
  auVar146._8_4_ = fVar233 * auVar64._8_4_;
  fVar245 = auVar81._12_4_;
  auVar146._12_4_ = fVar245 * auVar64._12_4_;
  auVar73._0_4_ = auVar74._0_4_ * fVar129;
  auVar73._4_4_ = auVar74._4_4_ * fVar250;
  auVar73._8_4_ = auVar74._8_4_ * fVar233;
  auVar73._12_4_ = auVar74._12_4_ * fVar245;
  auVar67._0_4_ = auVar79._0_4_ * fVar129;
  auVar67._4_4_ = auVar79._4_4_ * fVar250;
  auVar67._8_4_ = auVar79._8_4_ * fVar233;
  auVar67._12_4_ = auVar79._12_4_ * fVar245;
  auVar81 = vfmadd231ps_fma(auVar146,auVar80,auVar63);
  auVar85 = vfmadd231ps_fma(auVar73,auVar80,auVar77);
  auVar80 = vfmadd231ps_fma(auVar67,auVar76,auVar80);
  auVar84 = vfmadd231ps_fma(auVar81,auVar172,auVar62);
  auVar85 = vfmadd231ps_fma(auVar85,auVar172,auVar71);
  auVar83 = vfmadd231ps_fma(auVar80,auVar75,auVar172);
  auVar273._4_4_ = auVar153._0_4_;
  auVar273._0_4_ = auVar153._0_4_;
  auVar273._8_4_ = auVar153._0_4_;
  auVar273._12_4_ = auVar153._0_4_;
  auVar80 = vshufps_avx(auVar153,auVar153,0x55);
  auVar81 = vshufps_avx(auVar153,auVar153,0xaa);
  fVar129 = auVar81._0_4_;
  auVar173._0_4_ = fVar129 * auVar64._0_4_;
  fVar250 = auVar81._4_4_;
  auVar173._4_4_ = fVar250 * auVar64._4_4_;
  fVar233 = auVar81._8_4_;
  auVar173._8_4_ = fVar233 * auVar64._8_4_;
  fVar245 = auVar81._12_4_;
  auVar173._12_4_ = fVar245 * auVar64._12_4_;
  auVar163._0_4_ = auVar74._0_4_ * fVar129;
  auVar163._4_4_ = auVar74._4_4_ * fVar250;
  auVar163._8_4_ = auVar74._8_4_ * fVar233;
  auVar163._12_4_ = auVar74._12_4_ * fVar245;
  auVar154._0_4_ = auVar79._0_4_ * fVar129;
  auVar154._4_4_ = auVar79._4_4_ * fVar250;
  auVar154._8_4_ = auVar79._8_4_ * fVar233;
  auVar154._12_4_ = auVar79._12_4_ * fVar245;
  auVar63 = vfmadd231ps_fma(auVar173,auVar80,auVar63);
  auVar64 = vfmadd231ps_fma(auVar163,auVar80,auVar77);
  auVar77 = vfmadd231ps_fma(auVar154,auVar80,auVar76);
  auVar65 = vfmadd231ps_fma(auVar63,auVar273,auVar62);
  auVar66 = vfmadd231ps_fma(auVar64,auVar273,auVar71);
  auVar111._16_48_ = in_ZmmResult._16_48_;
  auVar62 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar286 = ZEXT1664(auVar62);
  auVar67 = vfmadd231ps_fma(auVar77,auVar273,auVar75);
  auVar63 = vandps_avx512vl(auVar84,auVar62);
  auVar198._8_4_ = 0x219392ef;
  auVar198._0_8_ = 0x219392ef219392ef;
  auVar198._12_4_ = 0x219392ef;
  uVar61 = vcmpps_avx512vl(auVar63,auVar198,1);
  bVar15 = (bool)((byte)uVar61 & 1);
  auVar68._0_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar84._0_4_;
  bVar15 = (bool)((byte)(uVar61 >> 1) & 1);
  auVar68._4_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar84._4_4_;
  bVar15 = (bool)((byte)(uVar61 >> 2) & 1);
  auVar68._8_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar84._8_4_;
  bVar15 = (bool)((byte)(uVar61 >> 3) & 1);
  auVar68._12_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar84._12_4_;
  auVar63 = vandps_avx512vl(auVar85,auVar62);
  uVar61 = vcmpps_avx512vl(auVar63,auVar198,1);
  bVar15 = (bool)((byte)uVar61 & 1);
  auVar69._0_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar85._0_4_;
  bVar15 = (bool)((byte)(uVar61 >> 1) & 1);
  auVar69._4_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar85._4_4_;
  bVar15 = (bool)((byte)(uVar61 >> 2) & 1);
  auVar69._8_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar85._8_4_;
  bVar15 = (bool)((byte)(uVar61 >> 3) & 1);
  auVar69._12_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar85._12_4_;
  auVar62 = vandps_avx512vl(auVar83,auVar62);
  uVar61 = vcmpps_avx512vl(auVar62,auVar198,1);
  bVar15 = (bool)((byte)uVar61 & 1);
  auVar70._0_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar83._0_4_;
  bVar15 = (bool)((byte)(uVar61 >> 1) & 1);
  auVar70._4_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar83._4_4_;
  bVar15 = (bool)((byte)(uVar61 >> 2) & 1);
  auVar70._8_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar83._8_4_;
  bVar15 = (bool)((byte)(uVar61 >> 3) & 1);
  auVar70._12_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar83._12_4_;
  auVar62 = vrcp14ps_avx512vl(auVar68);
  auVar63 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar287 = ZEXT1664(auVar63);
  auVar64 = vfnmadd213ps_avx512vl(auVar68,auVar62,auVar63);
  auVar84 = vfmadd132ps_fma(auVar64,auVar62,auVar62);
  auVar62 = vrcp14ps_avx512vl(auVar69);
  auVar64 = vfnmadd213ps_avx512vl(auVar69,auVar62,auVar63);
  auVar83 = vfmadd132ps_fma(auVar64,auVar62,auVar62);
  auVar62 = vrcp14ps_avx512vl(auVar70);
  auVar63 = vfnmadd213ps_avx512vl(auVar70,auVar62,auVar63);
  auVar82 = vfmadd132ps_fma(auVar63,auVar62,auVar62);
  fVar129 = (*(float *)(ray + k * 4 + 0x1c0) - *(float *)(prim + lVar56 + 0x16)) *
            *(float *)(prim + lVar56 + 0x1a);
  auVar185._4_4_ = fVar129;
  auVar185._0_4_ = fVar129;
  auVar185._8_4_ = fVar129;
  auVar185._12_4_ = fVar129;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = *(ulong *)(prim + uVar53 * 7 + 6);
  auVar62 = vpmovsxwd_avx(auVar62);
  auVar62 = vcvtdq2ps_avx(auVar62);
  auVar63._8_8_ = 0;
  auVar63._0_8_ = *(ulong *)(prim + uVar53 * 0xb + 6);
  auVar63 = vpmovsxwd_avx(auVar63);
  auVar63 = vcvtdq2ps_avx(auVar63);
  auVar71 = vsubps_avx(auVar63,auVar62);
  auVar64._8_8_ = 0;
  auVar64._0_8_ = *(ulong *)(prim + uVar53 * 9 + 6);
  auVar63 = vpmovsxwd_avx(auVar64);
  auVar64 = vfmadd213ps_fma(auVar71,auVar185,auVar62);
  auVar62 = vcvtdq2ps_avx(auVar63);
  auVar71._8_8_ = 0;
  auVar71._0_8_ = *(ulong *)(prim + uVar53 * 0xd + 6);
  auVar63 = vpmovsxwd_avx(auVar71);
  auVar63 = vcvtdq2ps_avx(auVar63);
  auVar63 = vsubps_avx(auVar63,auVar62);
  auVar71 = vfmadd213ps_fma(auVar63,auVar185,auVar62);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar53 * 0x12 + 6);
  auVar62 = vpmovsxwd_avx(auVar77);
  auVar62 = vcvtdq2ps_avx(auVar62);
  uVar61 = (ulong)(uint)((int)(uVar53 * 5) << 2);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar53 * 2 + uVar61 + 6);
  auVar63 = vpmovsxwd_avx(auVar74);
  auVar63 = vcvtdq2ps_avx(auVar63);
  auVar63 = vsubps_avx(auVar63,auVar62);
  auVar77 = vfmadd213ps_fma(auVar63,auVar185,auVar62);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar61 + 6);
  auVar62 = vpmovsxwd_avx(auVar75);
  auVar62 = vcvtdq2ps_avx(auVar62);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar53 * 0x18 + 6);
  auVar63 = vpmovsxwd_avx(auVar76);
  auVar63 = vcvtdq2ps_avx(auVar63);
  auVar63 = vsubps_avx(auVar63,auVar62);
  auVar74 = vfmadd213ps_fma(auVar63,auVar185,auVar62);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar53 * 0x1d + 6);
  auVar62 = vpmovsxwd_avx(auVar79);
  auVar62 = vcvtdq2ps_avx(auVar62);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar53 + (ulong)(byte)PVar6 * 0x20 + 6);
  auVar63 = vpmovsxwd_avx(auVar80);
  auVar63 = vcvtdq2ps_avx(auVar63);
  auVar63 = vsubps_avx(auVar63,auVar62);
  auVar75 = vfmadd213ps_fma(auVar63,auVar185,auVar62);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar6 * 0x20 - uVar53) + 6);
  auVar62 = vpmovsxwd_avx(auVar81);
  auVar62 = vcvtdq2ps_avx(auVar62);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar53 * 0x23 + 6);
  auVar63 = vpmovsxwd_avx(auVar85);
  auVar63 = vcvtdq2ps_avx(auVar63);
  auVar63 = vsubps_avx(auVar63,auVar62);
  auVar63 = vfmadd213ps_fma(auVar63,auVar185,auVar62);
  auVar62 = vsubps_avx(auVar64,auVar65);
  auVar186._0_4_ = auVar84._0_4_ * auVar62._0_4_;
  auVar186._4_4_ = auVar84._4_4_ * auVar62._4_4_;
  auVar186._8_4_ = auVar84._8_4_ * auVar62._8_4_;
  auVar186._12_4_ = auVar84._12_4_ * auVar62._12_4_;
  auVar62 = vsubps_avx(auVar71,auVar65);
  auVar147._0_4_ = auVar84._0_4_ * auVar62._0_4_;
  auVar147._4_4_ = auVar84._4_4_ * auVar62._4_4_;
  auVar147._8_4_ = auVar84._8_4_ * auVar62._8_4_;
  auVar147._12_4_ = auVar84._12_4_ * auVar62._12_4_;
  auVar62 = vsubps_avx(auVar77,auVar66);
  auVar174._0_4_ = auVar83._0_4_ * auVar62._0_4_;
  auVar174._4_4_ = auVar83._4_4_ * auVar62._4_4_;
  auVar174._8_4_ = auVar83._8_4_ * auVar62._8_4_;
  auVar174._12_4_ = auVar83._12_4_ * auVar62._12_4_;
  auVar62 = vsubps_avx(auVar74,auVar66);
  auVar78._0_4_ = auVar83._0_4_ * auVar62._0_4_;
  auVar78._4_4_ = auVar83._4_4_ * auVar62._4_4_;
  auVar78._8_4_ = auVar83._8_4_ * auVar62._8_4_;
  auVar78._12_4_ = auVar83._12_4_ * auVar62._12_4_;
  auVar62 = vsubps_avx(auVar75,auVar67);
  auVar164._0_4_ = auVar82._0_4_ * auVar62._0_4_;
  auVar164._4_4_ = auVar82._4_4_ * auVar62._4_4_;
  auVar164._8_4_ = auVar82._8_4_ * auVar62._8_4_;
  auVar164._12_4_ = auVar82._12_4_ * auVar62._12_4_;
  auVar62 = vsubps_avx(auVar63,auVar67);
  auVar72._0_4_ = auVar82._0_4_ * auVar62._0_4_;
  auVar72._4_4_ = auVar82._4_4_ * auVar62._4_4_;
  auVar72._8_4_ = auVar82._8_4_ * auVar62._8_4_;
  auVar72._12_4_ = auVar82._12_4_ * auVar62._12_4_;
  auVar62 = vpminsd_avx(auVar186,auVar147);
  auVar63 = vpminsd_avx(auVar174,auVar78);
  auVar62 = vmaxps_avx(auVar62,auVar63);
  auVar63 = vpminsd_avx(auVar164,auVar72);
  uVar130 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar84._4_4_ = uVar130;
  auVar84._0_4_ = uVar130;
  auVar84._8_4_ = uVar130;
  auVar84._12_4_ = uVar130;
  auVar63 = vmaxps_avx512vl(auVar63,auVar84);
  auVar62 = vmaxps_avx(auVar62,auVar63);
  auVar83._8_4_ = 0x3f7ffffa;
  auVar83._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar83._12_4_ = 0x3f7ffffa;
  local_5e0 = vmulps_avx512vl(auVar62,auVar83);
  auVar62 = vpmaxsd_avx(auVar186,auVar147);
  auVar63 = vpmaxsd_avx(auVar174,auVar78);
  auVar62 = vminps_avx(auVar62,auVar63);
  auVar63 = vpmaxsd_avx(auVar164,auVar72);
  uVar130 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar82._4_4_ = uVar130;
  auVar82._0_4_ = uVar130;
  auVar82._8_4_ = uVar130;
  auVar82._12_4_ = uVar130;
  auVar63 = vminps_avx512vl(auVar63,auVar82);
  auVar62 = vminps_avx(auVar62,auVar63);
  auVar65._8_4_ = 0x3f800003;
  auVar65._0_8_ = 0x3f8000033f800003;
  auVar65._12_4_ = 0x3f800003;
  auVar62 = vmulps_avx512vl(auVar62,auVar65);
  auVar63 = vpbroadcastd_avx512vl();
  uVar31 = vcmpps_avx512vl(local_5e0,auVar62,2);
  uVar61 = vpcmpgtd_avx512vl(auVar63,_DAT_01ff0cf0);
  uVar61 = ((byte)uVar31 & 0xf) & uVar61;
  if ((char)uVar61 == '\0') {
    return;
  }
  auVar135 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_380 = vmovdqa64_avx512f(auVar135);
  auVar62 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
  auVar290 = ZEXT1664(auVar62);
  auVar111._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar135 = ZEXT1664(auVar111._0_16_);
LAB_01c28f73:
  lVar56 = 0;
  for (uVar53 = uVar61; (uVar53 & 1) == 0; uVar53 = uVar53 >> 1 | 0x8000000000000000) {
    lVar56 = lVar56 + 1;
  }
  uVar60 = *(uint *)(prim + 2);
  pGVar9 = (context->scene->geometries).items[uVar60].ptr;
  fVar129 = (pGVar9->time_range).lower;
  fVar129 = pGVar9->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x1c0) - fVar129) / ((pGVar9->time_range).upper - fVar129));
  auVar62 = vroundss_avx(ZEXT416((uint)fVar129),ZEXT416((uint)fVar129),9);
  uVar7 = *(uint *)(prim + lVar56 * 4 + 6);
  auVar62 = vminss_avx(auVar62,ZEXT416((uint)(pGVar9->fnumTimeSegments + -1.0)));
  auVar284._16_48_ = auVar111._16_48_;
  auVar65 = vmaxss_avx512f(auVar290._0_16_,auVar62);
  uVar53 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                           (ulong)uVar7 *
                           pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var10 = pGVar9[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar55 = (long)(int)auVar65._0_4_ * 0x38;
  lVar11 = *(long *)(_Var10 + lVar55);
  lVar12 = *(long *)(_Var10 + 0x10 + lVar55);
  auVar62 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar53);
  lVar56 = uVar53 + 1;
  auVar63 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar56);
  lVar1 = uVar53 + 2;
  auVar64 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
  lVar2 = uVar53 + 3;
  auVar71 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar2);
  lVar11 = *(long *)&pGVar9[4].fnumTimeSegments;
  lVar12 = *(long *)(lVar11 + lVar55);
  lVar13 = *(long *)(lVar11 + 0x10 + lVar55);
  auVar77 = *(undefined1 (*) [16])(lVar12 + lVar13 * uVar53);
  auVar74 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar56);
  auVar75 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar1);
  auVar76 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar2);
  lVar12 = *(long *)(_Var10 + 0x38 + lVar55);
  lVar13 = *(long *)(_Var10 + 0x48 + lVar55);
  auVar79 = *(undefined1 (*) [16])(lVar12 + lVar13 * uVar53);
  auVar80 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar56);
  auVar81 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar1);
  auVar85 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar2);
  lVar12 = *(long *)(lVar11 + 0x38 + lVar55);
  lVar11 = *(long *)(lVar11 + 0x48 + lVar55);
  auVar84 = *(undefined1 (*) [16])(lVar12 + uVar53 * lVar11);
  auVar83 = *(undefined1 (*) [16])(lVar12 + lVar56 * lVar11);
  auVar82 = *(undefined1 (*) [16])(lVar12 + lVar1 * lVar11);
  auVar65 = vsubss_avx512f(ZEXT416((uint)fVar129),auVar65);
  auVar284._0_16_ = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
  auVar66 = vmulps_avx512vl(auVar71,auVar284._0_16_);
  auVar66 = vfmadd231ps_avx512vl(auVar66,auVar64,auVar284._0_16_);
  auVar67 = vfmadd213ps_avx512vl(ZEXT816(0) << 0x20,auVar63,auVar66);
  auVar67 = vaddps_avx512vl(auVar62,auVar67);
  auVar146 = auVar135._0_16_;
  auVar66 = vfmadd231ps_avx512vl(auVar66,auVar63,auVar146);
  auVar66 = vfnmadd231ps_avx512vl(auVar66,auVar62,auVar146);
  auVar68 = vmulps_avx512vl(auVar76,auVar284._0_16_);
  auVar68 = vfmadd231ps_avx512vl(auVar68,auVar75,auVar284._0_16_);
  auVar69 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
  auVar69 = vfmadd213ps_avx512vl(auVar69,auVar74,auVar68);
  auVar70 = vaddps_avx512vl(auVar77,auVar69);
  auVar68 = vfmadd231ps_avx512vl(auVar68,auVar74,auVar146);
  auVar68 = vfnmadd231ps_avx512vl(auVar68,auVar77,auVar146);
  auVar69 = vxorps_avx512vl(auVar69,auVar69);
  auVar69 = vfmadd213ps_avx512vl(auVar69,auVar64,auVar71);
  auVar69 = vfmadd231ps_avx512vl(auVar69,auVar63,auVar284._0_16_);
  auVar69 = vfmadd231ps_avx512vl(auVar69,auVar62,auVar284._0_16_);
  auVar71 = vmulps_avx512vl(auVar71,auVar146);
  auVar64 = vfnmadd231ps_avx512vl(auVar71,auVar146,auVar64);
  auVar63 = vfmadd231ps_avx512vl(auVar64,auVar284._0_16_,auVar63);
  auVar72 = vfnmadd231ps_avx512vl(auVar63,auVar284._0_16_,auVar62);
  auVar62 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar75,auVar76);
  auVar62 = vfmadd231ps_avx512vl(auVar62,auVar74,auVar284._0_16_);
  auVar73 = vfmadd231ps_avx512vl(auVar62,auVar77,auVar284._0_16_);
  auVar62 = vmulps_avx512vl(auVar76,auVar146);
  auVar62 = vfnmadd231ps_avx512vl(auVar62,auVar146,auVar75);
  auVar62 = vfmadd231ps_avx512vl(auVar62,auVar284._0_16_,auVar74);
  auVar74 = vfnmadd231ps_avx512vl(auVar62,auVar284._0_16_,auVar77);
  auVar63 = vshufps_avx512vl(auVar66,auVar66,0xc9);
  auVar62 = vshufps_avx512vl(auVar70,auVar70,0xc9);
  auVar62 = vmulps_avx512vl(auVar66,auVar62);
  auVar62 = vfmsub231ps_avx512vl(auVar62,auVar63,auVar70);
  auVar64 = vshufps_avx(auVar62,auVar62,0xc9);
  auVar62 = vshufps_avx(auVar68,auVar68,0xc9);
  auVar62 = vmulps_avx512vl(auVar66,auVar62);
  auVar62 = vfmsub231ps_fma(auVar62,auVar63,auVar68);
  auVar71 = vshufps_avx(auVar62,auVar62,0xc9);
  auVar62 = vshufps_avx(auVar72,auVar72,0xc9);
  auVar63 = vshufps_avx(auVar73,auVar73,0xc9);
  auVar187._0_4_ = auVar72._0_4_ * auVar63._0_4_;
  auVar187._4_4_ = auVar72._4_4_ * auVar63._4_4_;
  auVar187._8_4_ = auVar72._8_4_ * auVar63._8_4_;
  auVar187._12_4_ = auVar72._12_4_ * auVar63._12_4_;
  auVar63 = vfmsub231ps_fma(auVar187,auVar62,auVar73);
  auVar77 = vshufps_avx(auVar63,auVar63,0xc9);
  auVar63 = vshufps_avx(auVar74,auVar74,0xc9);
  auVar188._0_4_ = auVar72._0_4_ * auVar63._0_4_;
  auVar188._4_4_ = auVar72._4_4_ * auVar63._4_4_;
  auVar188._8_4_ = auVar72._8_4_ * auVar63._8_4_;
  auVar188._12_4_ = auVar72._12_4_ * auVar63._12_4_;
  auVar62 = vfmsub231ps_fma(auVar188,auVar62,auVar74);
  auVar74 = vshufps_avx(auVar62,auVar62,0xc9);
  auVar62 = vdpps_avx(auVar64,auVar64,0x7f);
  auVar135._4_60_ = auVar284._4_60_;
  auVar135._0_4_ = auVar62._0_4_;
  auVar63 = vrsqrt14ss_avx512f(auVar284._0_16_,auVar135._0_16_);
  auVar75 = vmulss_avx512f(auVar63,ZEXT416(0x3fc00000));
  auVar76 = vmulss_avx512f(auVar62,ZEXT416(0x3f000000));
  auVar76 = vmulss_avx512f(auVar76,auVar63);
  auVar63 = vmulss_avx512f(auVar76,ZEXT416((uint)(auVar63._0_4_ * auVar63._0_4_)));
  fVar233 = auVar75._0_4_ - auVar63._0_4_;
  auVar210._4_4_ = fVar233;
  auVar210._0_4_ = fVar233;
  auVar210._8_4_ = fVar233;
  auVar210._12_4_ = fVar233;
  auVar63 = vdpps_avx(auVar64,auVar71,0x7f);
  auVar75 = vmulps_avx512vl(auVar64,auVar210);
  auVar76 = vbroadcastss_avx512vl(auVar62);
  auVar71 = vmulps_avx512vl(auVar76,auVar71);
  fVar129 = auVar63._0_4_;
  auVar175._0_4_ = fVar129 * auVar64._0_4_;
  auVar175._4_4_ = fVar129 * auVar64._4_4_;
  auVar175._8_4_ = fVar129 * auVar64._8_4_;
  auVar175._12_4_ = fVar129 * auVar64._12_4_;
  auVar64 = vsubps_avx(auVar71,auVar175);
  auVar63 = vrcp14ss_avx512f(auVar284._0_16_,auVar135._0_16_);
  auVar62 = vfnmadd213ss_avx512f(auVar62,auVar63,ZEXT416(0x40000000));
  fVar129 = auVar63._0_4_ * auVar62._0_4_;
  auVar62 = vdpps_avx(auVar77,auVar77,0x7f);
  auVar288._16_48_ = auVar284._16_48_;
  auVar288._0_16_ = auVar284._0_16_;
  auVar285._4_60_ = auVar288._4_60_;
  auVar285._0_4_ = auVar62._0_4_;
  auVar63 = vrsqrt14ss_avx512f(auVar284._0_16_,auVar285._0_16_);
  auVar71 = vmulss_avx512f(auVar63,ZEXT416(0x3fc00000));
  auVar76 = vmulss_avx512f(auVar62,ZEXT416(0x3f000000));
  fVar250 = auVar63._0_4_;
  fVar245 = auVar71._0_4_ - auVar76._0_4_ * fVar250 * fVar250 * fVar250;
  auVar211._0_4_ = auVar77._0_4_ * fVar245;
  auVar211._4_4_ = auVar77._4_4_ * fVar245;
  auVar211._8_4_ = auVar77._8_4_ * fVar245;
  auVar211._12_4_ = auVar77._12_4_ * fVar245;
  auVar63 = vdpps_avx(auVar77,auVar74,0x7f);
  auVar71 = vbroadcastss_avx512vl(auVar62);
  auVar71 = vmulps_avx512vl(auVar71,auVar74);
  fVar250 = auVar63._0_4_;
  auVar136._0_4_ = fVar250 * auVar77._0_4_;
  auVar136._4_4_ = fVar250 * auVar77._4_4_;
  auVar136._8_4_ = fVar250 * auVar77._8_4_;
  auVar136._12_4_ = fVar250 * auVar77._12_4_;
  auVar63 = vsubps_avx(auVar71,auVar136);
  auVar71 = vrcp14ss_avx512f(auVar284._0_16_,auVar285._0_16_);
  auVar62 = vfnmadd213ss_avx512f(auVar62,auVar71,ZEXT416(0x40000000));
  fVar250 = auVar71._0_4_ * auVar62._0_4_;
  auVar62 = vshufps_avx512vl(auVar67,auVar67,0xff);
  auVar71 = vmulps_avx512vl(auVar62,auVar75);
  auVar68 = vsubps_avx512vl(auVar67,auVar71);
  auVar77 = vshufps_avx512vl(auVar66,auVar66,0xff);
  auVar77 = vmulps_avx512vl(auVar77,auVar75);
  auVar165._0_4_ = auVar77._0_4_ + auVar62._0_4_ * fVar233 * fVar129 * auVar64._0_4_;
  auVar165._4_4_ = auVar77._4_4_ + auVar62._4_4_ * fVar233 * fVar129 * auVar64._4_4_;
  auVar165._8_4_ = auVar77._8_4_ + auVar62._8_4_ * fVar233 * fVar129 * auVar64._8_4_;
  auVar165._12_4_ = auVar77._12_4_ + auVar62._12_4_ * fVar233 * fVar129 * auVar64._12_4_;
  auVar64 = vsubps_avx512vl(auVar66,auVar165);
  auVar67 = vaddps_avx512vl(auVar67,auVar71);
  auVar71 = vaddps_avx512vl(auVar66,auVar165);
  auVar62 = vshufps_avx512vl(auVar69,auVar69,0xff);
  auVar77 = vmulps_avx512vl(auVar62,auVar211);
  auVar66 = vsubps_avx512vl(auVar69,auVar77);
  auVar74 = vshufps_avx512vl(auVar72,auVar72,0xff);
  auVar75 = vmulps_avx512vl(auVar74,auVar211);
  auVar212._0_4_ = auVar75._0_4_ + auVar62._0_4_ * fVar245 * auVar63._0_4_ * fVar250;
  auVar212._4_4_ = auVar75._4_4_ + auVar62._4_4_ * fVar245 * auVar63._4_4_ * fVar250;
  auVar212._8_4_ = auVar75._8_4_ + auVar62._8_4_ * fVar245 * auVar63._8_4_ * fVar250;
  auVar212._12_4_ = auVar75._12_4_ + auVar62._12_4_ * fVar245 * auVar63._12_4_ * fVar250;
  auVar62 = vsubps_avx(auVar72,auVar212);
  auVar69 = vaddps_avx512vl(auVar69,auVar77);
  auVar63 = vaddps_avx512vl(auVar72,auVar212);
  auVar131._8_4_ = 0x3eaaaaab;
  auVar131._0_8_ = 0x3eaaaaab3eaaaaab;
  auVar131._12_4_ = 0x3eaaaaab;
  auVar199._0_4_ = auVar68._0_4_ + auVar64._0_4_ * 0.33333334;
  auVar199._4_4_ = auVar68._4_4_ + auVar64._4_4_ * 0.33333334;
  auVar199._8_4_ = auVar68._8_4_ + auVar64._8_4_ * 0.33333334;
  auVar199._12_4_ = auVar68._12_4_ + auVar64._12_4_ * 0.33333334;
  auVar189._0_4_ = auVar62._0_4_ * 0.33333334;
  auVar189._4_4_ = auVar62._4_4_ * 0.33333334;
  auVar189._8_4_ = auVar62._8_4_ * 0.33333334;
  auVar189._12_4_ = auVar62._12_4_ * 0.33333334;
  auVar75 = vsubps_avx(auVar66,auVar189);
  auVar176._0_4_ = auVar71._0_4_ * 0.33333334;
  auVar176._4_4_ = auVar71._4_4_ * 0.33333334;
  auVar176._8_4_ = auVar71._8_4_ * 0.33333334;
  auVar176._12_4_ = auVar71._12_4_ * 0.33333334;
  auVar70 = vaddps_avx512vl(auVar67,auVar176);
  auVar62 = vmulps_avx512vl(auVar63,auVar131);
  auVar76 = vsubps_avx(auVar69,auVar62);
  auVar62 = *(undefined1 (*) [16])(lVar12 + lVar11 * lVar2);
  auVar64 = vmulps_avx512vl(auVar85,auVar284._0_16_);
  auVar64 = vfmadd231ps_avx512vl(auVar64,auVar81,auVar284._0_16_);
  auVar63 = vxorps_avx512vl(auVar63,auVar63);
  auVar63 = vfmadd213ps_avx512vl(auVar63,auVar80,auVar64);
  auVar72 = vaddps_avx512vl(auVar79,auVar63);
  auVar63 = vfmadd231ps_avx512vl(auVar64,auVar80,auVar146);
  auVar73 = vfnmadd231ps_avx512vl(auVar63,auVar79,auVar146);
  auVar63 = vmulps_avx512vl(auVar62,auVar284._0_16_);
  auVar63 = vfmadd231ps_avx512vl(auVar63,auVar82,auVar284._0_16_);
  auVar64 = vxorps_avx512vl(auVar74,auVar74);
  auVar64 = vfmadd213ps_avx512vl(auVar64,auVar83,auVar63);
  auVar71 = vaddps_avx512vl(auVar84,auVar64);
  auVar63 = vfmadd231ps_avx512vl(auVar63,auVar83,auVar146);
  auVar63 = vfnmadd231ps_avx512vl(auVar63,auVar84,auVar146);
  auVar64 = vxorps_avx512vl(auVar64,auVar64);
  auVar64 = vfmadd213ps_avx512vl(auVar64,auVar81,auVar85);
  auVar64 = vfmadd231ps_avx512vl(auVar64,auVar80,auVar284._0_16_);
  auVar78 = vfmadd231ps_avx512vl(auVar64,auVar79,auVar284._0_16_);
  auVar64 = vmulps_avx512vl(auVar85,auVar146);
  auVar64 = vfnmadd231ps_avx512vl(auVar64,auVar146,auVar81);
  auVar64 = vfmadd231ps_avx512vl(auVar64,auVar284._0_16_,auVar80);
  auVar79 = vfnmadd231ps_avx512vl(auVar64,auVar284._0_16_,auVar79);
  auVar64 = vfmadd213ps_avx512vl(ZEXT816(0) << 0x20,auVar82,auVar62);
  auVar64 = vfmadd231ps_avx512vl(auVar64,auVar83,auVar284._0_16_);
  auVar77 = vfmadd231ps_avx512vl(auVar64,auVar84,auVar284._0_16_);
  auVar62 = vmulps_avx512vl(auVar62,auVar146);
  auVar62 = vfnmadd231ps_avx512vl(auVar62,auVar146,auVar82);
  auVar62 = vfmadd231ps_avx512vl(auVar62,auVar284._0_16_,auVar83);
  auVar74 = vfnmadd231ps_avx512vl(auVar62,auVar284._0_16_,auVar84);
  auVar62 = vshufps_avx(auVar73,auVar73,0xc9);
  auVar64 = vshufps_avx512vl(auVar71,auVar71,0xc9);
  fVar245 = auVar73._0_4_;
  auVar257._0_4_ = fVar245 * auVar64._0_4_;
  fVar246 = auVar73._4_4_;
  auVar257._4_4_ = fVar246 * auVar64._4_4_;
  fVar247 = auVar73._8_4_;
  auVar257._8_4_ = fVar247 * auVar64._8_4_;
  fVar248 = auVar73._12_4_;
  auVar257._12_4_ = fVar248 * auVar64._12_4_;
  auVar64 = vfmsub231ps_avx512vl(auVar257,auVar62,auVar71);
  auVar64 = vshufps_avx(auVar64,auVar64,0xc9);
  auVar71 = vshufps_avx512vl(auVar63,auVar63,0xc9);
  auVar267._0_4_ = fVar245 * auVar71._0_4_;
  auVar267._4_4_ = fVar246 * auVar71._4_4_;
  auVar267._8_4_ = fVar247 * auVar71._8_4_;
  auVar267._12_4_ = fVar248 * auVar71._12_4_;
  auVar62 = vfmsub231ps_avx512vl(auVar267,auVar62,auVar63);
  auVar71 = vshufps_avx(auVar62,auVar62,0xc9);
  auVar80 = vshufps_avx512vl(auVar79,auVar79,0xc9);
  auVar62 = vshufps_avx(auVar77,auVar77,0xc9);
  auVar62 = vmulps_avx512vl(auVar79,auVar62);
  auVar62 = vfmsub231ps_fma(auVar62,auVar80,auVar77);
  auVar77 = vshufps_avx(auVar62,auVar62,0xc9);
  auVar63 = vshufps_avx(auVar74,auVar74,0xc9);
  auVar62 = vdpps_avx(auVar64,auVar64,0x7f);
  auVar63 = vmulps_avx512vl(auVar79,auVar63);
  auVar63 = vfmsub231ps_fma(auVar63,auVar80,auVar74);
  auVar74 = vshufps_avx(auVar63,auVar63,0xc9);
  auVar108._16_48_ = auVar284._16_48_;
  auVar108._0_16_ = auVar284._0_16_;
  auVar107._4_60_ = auVar108._4_60_;
  auVar107._0_4_ = auVar62._0_4_;
  auVar63 = vrsqrt14ss_avx512f(auVar284._0_16_,auVar107._0_16_);
  auVar80 = vmulss_avx512f(auVar63,ZEXT416(0x3fc00000));
  auVar81 = vmulss_avx512f(auVar62,ZEXT416(0x3f000000));
  auVar81 = vmulss_avx512f(auVar81,auVar63);
  auVar63 = vmulss_avx512f(auVar81,ZEXT416((uint)(auVar63._0_4_ * auVar63._0_4_)));
  auVar63 = vsubss_avx512f(auVar80,auVar63);
  auVar280._0_4_ = auVar63._0_4_;
  auVar280._4_4_ = auVar280._0_4_;
  auVar280._8_4_ = auVar280._0_4_;
  auVar280._12_4_ = auVar280._0_4_;
  auVar80 = vmulps_avx512vl(auVar64,auVar280);
  auVar63 = vdpps_avx(auVar64,auVar71,0x7f);
  auVar81 = vbroadcastss_avx512vl(auVar62);
  auVar71 = vmulps_avx512vl(auVar81,auVar71);
  fVar129 = auVar63._0_4_;
  auVar190._0_4_ = auVar64._0_4_ * fVar129;
  auVar190._4_4_ = auVar64._4_4_ * fVar129;
  auVar190._8_4_ = auVar64._8_4_ * fVar129;
  auVar190._12_4_ = auVar64._12_4_ * fVar129;
  auVar64 = vsubps_avx(auVar71,auVar190);
  auVar63 = vrcp14ss_avx512f(auVar284._0_16_,auVar107._0_16_);
  auVar62 = vfnmadd213ss_avx512f(auVar62,auVar63,ZEXT416(0x40000000));
  fVar129 = auVar63._0_4_ * auVar62._0_4_;
  auVar62 = vdpps_avx(auVar77,auVar77,0x7f);
  auVar110._16_48_ = auVar284._16_48_;
  auVar110._0_16_ = auVar284._0_16_;
  auVar109._4_60_ = auVar110._4_60_;
  auVar109._0_4_ = auVar62._0_4_;
  auVar63 = vrsqrt14ss_avx512f(auVar284._0_16_,auVar109._0_16_);
  auVar71 = vmulss_avx512f(auVar63,ZEXT416(0x3fc00000));
  auVar81 = vmulss_avx512f(auVar62,ZEXT416(0x3f000000));
  auVar82 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  fVar250 = auVar63._0_4_;
  fVar233 = auVar71._0_4_ - auVar81._0_4_ * fVar250 * fVar250 * fVar250;
  auVar274._0_4_ = auVar77._0_4_ * fVar233;
  auVar274._4_4_ = auVar77._4_4_ * fVar233;
  auVar274._8_4_ = auVar77._8_4_ * fVar233;
  auVar274._12_4_ = auVar77._12_4_ * fVar233;
  auVar63 = vdpps_avx(auVar77,auVar74,0x7f);
  auVar71 = vbroadcastss_avx512vl(auVar62);
  auVar71 = vmulps_avx512vl(auVar71,auVar74);
  fVar250 = auVar63._0_4_;
  auVar234._0_4_ = auVar77._0_4_ * fVar250;
  auVar234._4_4_ = auVar77._4_4_ * fVar250;
  auVar234._8_4_ = auVar77._8_4_ * fVar250;
  auVar234._12_4_ = auVar77._12_4_ * fVar250;
  auVar63 = vsubps_avx(auVar71,auVar234);
  auVar71 = vrcp14ss_avx512f(auVar284._0_16_,auVar109._0_16_);
  auVar62 = vfnmadd213ss_avx512f(auVar62,auVar71,ZEXT416(0x40000000));
  auVar288 = ZEXT464(0x3f800000);
  fVar250 = auVar62._0_4_ * auVar71._0_4_;
  auVar71 = vshufps_avx512vl(auVar72,auVar72,0xff);
  auVar77 = vmulps_avx512vl(auVar71,auVar80);
  auVar74 = vsubps_avx512vl(auVar72,auVar77);
  auVar62 = vshufps_avx(auVar73,auVar73,0xff);
  auVar62 = vmulps_avx512vl(auVar62,auVar80);
  auVar177._0_4_ = auVar62._0_4_ + auVar71._0_4_ * auVar280._0_4_ * fVar129 * auVar64._0_4_;
  auVar177._4_4_ = auVar62._4_4_ + auVar71._4_4_ * auVar280._0_4_ * fVar129 * auVar64._4_4_;
  auVar177._8_4_ = auVar62._8_4_ + auVar71._8_4_ * auVar280._0_4_ * fVar129 * auVar64._8_4_;
  auVar177._12_4_ = auVar62._12_4_ + auVar71._12_4_ * auVar280._0_4_ * fVar129 * auVar64._12_4_;
  auVar62 = vsubps_avx(auVar73,auVar177);
  auVar64 = vaddps_avx512vl(auVar72,auVar77);
  auVar71 = vshufps_avx512vl(auVar78,auVar78,0xff);
  auVar268._0_4_ = auVar71._0_4_ * auVar274._0_4_;
  auVar268._4_4_ = auVar71._4_4_ * auVar274._4_4_;
  auVar268._8_4_ = auVar71._8_4_ * auVar274._8_4_;
  auVar268._12_4_ = auVar71._12_4_ * auVar274._12_4_;
  auVar77 = vsubps_avx512vl(auVar78,auVar268);
  auVar80 = vshufps_avx512vl(auVar79,auVar79,0xff);
  auVar80 = vmulps_avx512vl(auVar80,auVar274);
  auVar191._0_4_ = auVar80._0_4_ + auVar71._0_4_ * fVar233 * auVar63._0_4_ * fVar250;
  auVar191._4_4_ = auVar80._4_4_ + auVar71._4_4_ * fVar233 * auVar63._4_4_ * fVar250;
  auVar191._8_4_ = auVar80._8_4_ + auVar71._8_4_ * fVar233 * auVar63._8_4_ * fVar250;
  auVar191._12_4_ = auVar80._12_4_ + auVar71._12_4_ * fVar233 * auVar63._12_4_ * fVar250;
  auVar63 = vsubps_avx512vl(auVar79,auVar191);
  auVar71 = vaddps_avx512vl(auVar78,auVar268);
  auVar79 = vaddps_avx512vl(auVar79,auVar191);
  auVar235._0_4_ = auVar74._0_4_ + auVar62._0_4_ * 0.33333334;
  auVar235._4_4_ = auVar74._4_4_ + auVar62._4_4_ * 0.33333334;
  auVar235._8_4_ = auVar74._8_4_ + auVar62._8_4_ * 0.33333334;
  auVar235._12_4_ = auVar74._12_4_ + auVar62._12_4_ * 0.33333334;
  auVar229._0_4_ = auVar63._0_4_ * 0.33333334;
  auVar229._4_4_ = auVar63._4_4_ * 0.33333334;
  auVar229._8_4_ = auVar63._8_4_ * 0.33333334;
  auVar229._12_4_ = auVar63._12_4_ * 0.33333334;
  auVar62 = vsubps_avx(auVar77,auVar229);
  auVar178._0_4_ = auVar64._0_4_ + (fVar245 + auVar177._0_4_) * 0.33333334;
  auVar178._4_4_ = auVar64._4_4_ + (fVar246 + auVar177._4_4_) * 0.33333334;
  auVar178._8_4_ = auVar64._8_4_ + (fVar247 + auVar177._8_4_) * 0.33333334;
  auVar178._12_4_ = auVar64._12_4_ + (fVar248 + auVar177._12_4_) * 0.33333334;
  auVar192._0_4_ = auVar79._0_4_ * 0.33333334;
  auVar192._4_4_ = auVar79._4_4_ * 0.33333334;
  auVar192._8_4_ = auVar79._8_4_ * 0.33333334;
  auVar192._12_4_ = auVar79._12_4_ * 0.33333334;
  auVar63 = vsubps_avx(auVar71,auVar192);
  auVar79 = vbroadcastss_avx512vl(auVar65);
  auVar80 = vsubss_avx512f(ZEXT416(0x3f800000),auVar65);
  auVar132._0_4_ = auVar80._0_4_;
  auVar132._4_4_ = auVar132._0_4_;
  auVar132._8_4_ = auVar132._0_4_;
  auVar132._12_4_ = auVar132._0_4_;
  auVar74 = vmulps_avx512vl(auVar79,auVar74);
  auVar80 = vmulps_avx512vl(auVar79,auVar235);
  auVar62 = vmulps_avx512vl(auVar79,auVar62);
  auVar281._0_4_ = auVar79._0_4_ * auVar77._0_4_;
  auVar281._4_4_ = auVar79._4_4_ * auVar77._4_4_;
  auVar281._8_4_ = auVar79._8_4_ * auVar77._8_4_;
  auVar281._12_4_ = auVar79._12_4_ * auVar77._12_4_;
  local_520 = vfmadd231ps_avx512vl(auVar74,auVar132,auVar68);
  local_530 = vfmadd231ps_avx512vl(auVar80,auVar132,auVar199);
  local_540 = vfmadd231ps_avx512vl(auVar62,auVar132,auVar75);
  local_550 = vfmadd231ps_fma(auVar281,auVar132,auVar66);
  auVar62 = vmulps_avx512vl(auVar79,auVar64);
  auVar64 = vmulps_avx512vl(auVar79,auVar178);
  auVar63 = vmulps_avx512vl(auVar79,auVar63);
  auVar269._0_4_ = auVar79._0_4_ * auVar71._0_4_;
  auVar269._4_4_ = auVar79._4_4_ * auVar71._4_4_;
  auVar269._8_4_ = auVar79._8_4_ * auVar71._8_4_;
  auVar269._12_4_ = auVar79._12_4_ * auVar71._12_4_;
  _local_560 = vfmadd231ps_avx512vl(auVar62,auVar132,auVar67);
  _local_570 = vfmadd231ps_avx512vl(auVar64,auVar132,auVar70);
  _local_580 = vfmadd231ps_avx512vl(auVar63,auVar132,auVar76);
  _local_590 = vfmadd231ps_fma(auVar269,auVar132,auVar69);
  auVar62 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x1c);
  auVar62 = vinsertps_avx(auVar62,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  fVar129 = *(float *)(ray + k * 4 + 0xc0);
  local_4a0 = vsubps_avx512vl(local_520,auVar62);
  uVar130 = local_4a0._0_4_;
  auVar137._4_4_ = uVar130;
  auVar137._0_4_ = uVar130;
  auVar137._8_4_ = uVar130;
  auVar137._12_4_ = uVar130;
  auVar63 = vshufps_avx(local_4a0,local_4a0,0x55);
  auVar64 = vshufps_avx(local_4a0,local_4a0,0xaa);
  aVar4 = pre->ray_space[k].vx.field_0;
  aVar5 = pre->ray_space[k].vy.field_0;
  fVar250 = pre->ray_space[k].vz.field_0.m128[0];
  fVar233 = pre->ray_space[k].vz.field_0.m128[1];
  fVar245 = pre->ray_space[k].vz.field_0.m128[2];
  fVar246 = pre->ray_space[k].vz.field_0.m128[3];
  auVar133._0_4_ = fVar250 * auVar64._0_4_;
  auVar133._4_4_ = fVar233 * auVar64._4_4_;
  auVar133._8_4_ = fVar245 * auVar64._8_4_;
  auVar133._12_4_ = fVar246 * auVar64._12_4_;
  auVar63 = vfmadd231ps_fma(auVar133,(undefined1  [16])aVar5,auVar63);
  auVar75 = vfmadd231ps_fma(auVar63,(undefined1  [16])aVar4,auVar137);
  local_4b0 = vsubps_avx512vl(local_530,auVar62);
  uVar130 = local_4b0._0_4_;
  auVar148._4_4_ = uVar130;
  auVar148._0_4_ = uVar130;
  auVar148._8_4_ = uVar130;
  auVar148._12_4_ = uVar130;
  auVar63 = vshufps_avx(local_4b0,local_4b0,0x55);
  auVar64 = vshufps_avx(local_4b0,local_4b0,0xaa);
  auVar138._0_4_ = fVar250 * auVar64._0_4_;
  auVar138._4_4_ = fVar233 * auVar64._4_4_;
  auVar138._8_4_ = fVar245 * auVar64._8_4_;
  auVar138._12_4_ = fVar246 * auVar64._12_4_;
  auVar63 = vfmadd231ps_fma(auVar138,(undefined1  [16])aVar5,auVar63);
  auVar76 = vfmadd231ps_fma(auVar63,(undefined1  [16])aVar4,auVar148);
  local_4c0 = vsubps_avx512vl(local_540,auVar62);
  uVar130 = local_4c0._0_4_;
  auVar193._4_4_ = uVar130;
  auVar193._0_4_ = uVar130;
  auVar193._8_4_ = uVar130;
  auVar193._12_4_ = uVar130;
  auVar63 = vshufps_avx(local_4c0,local_4c0,0x55);
  auVar64 = vshufps_avx(local_4c0,local_4c0,0xaa);
  auVar149._0_4_ = fVar250 * auVar64._0_4_;
  auVar149._4_4_ = fVar233 * auVar64._4_4_;
  auVar149._8_4_ = fVar245 * auVar64._8_4_;
  auVar149._12_4_ = fVar246 * auVar64._12_4_;
  auVar63 = vfmadd231ps_fma(auVar149,(undefined1  [16])aVar5,auVar63);
  auVar79 = vfmadd231ps_fma(auVar63,(undefined1  [16])aVar4,auVar193);
  local_4d0 = vsubps_avx(local_550,auVar62);
  uVar130 = local_4d0._0_4_;
  auVar213._4_4_ = uVar130;
  auVar213._0_4_ = uVar130;
  auVar213._8_4_ = uVar130;
  auVar213._12_4_ = uVar130;
  auVar63 = vshufps_avx(local_4d0,local_4d0,0x55);
  auVar64 = vshufps_avx(local_4d0,local_4d0,0xaa);
  auVar194._0_4_ = fVar250 * auVar64._0_4_;
  auVar194._4_4_ = fVar233 * auVar64._4_4_;
  auVar194._8_4_ = fVar245 * auVar64._8_4_;
  auVar194._12_4_ = fVar246 * auVar64._12_4_;
  auVar63 = vfmadd231ps_fma(auVar194,(undefined1  [16])aVar5,auVar63);
  auVar80 = vfmadd231ps_fma(auVar63,(undefined1  [16])aVar4,auVar213);
  local_4e0 = vsubps_avx512vl(_local_560,auVar62);
  uVar130 = local_4e0._0_4_;
  auVar214._4_4_ = uVar130;
  auVar214._0_4_ = uVar130;
  auVar214._8_4_ = uVar130;
  auVar214._12_4_ = uVar130;
  auVar63 = vshufps_avx(local_4e0,local_4e0,0x55);
  auVar64 = vshufps_avx(local_4e0,local_4e0,0xaa);
  auVar236._0_4_ = auVar64._0_4_ * fVar250;
  auVar236._4_4_ = auVar64._4_4_ * fVar233;
  auVar236._8_4_ = auVar64._8_4_ * fVar245;
  auVar236._12_4_ = auVar64._12_4_ * fVar246;
  auVar63 = vfmadd231ps_fma(auVar236,(undefined1  [16])aVar5,auVar63);
  auVar81 = vfmadd231ps_fma(auVar63,(undefined1  [16])aVar4,auVar214);
  local_4f0 = vsubps_avx512vl(_local_570,auVar62);
  uVar130 = local_4f0._0_4_;
  auVar215._4_4_ = uVar130;
  auVar215._0_4_ = uVar130;
  auVar215._8_4_ = uVar130;
  auVar215._12_4_ = uVar130;
  auVar63 = vshufps_avx(local_4f0,local_4f0,0x55);
  auVar64 = vshufps_avx(local_4f0,local_4f0,0xaa);
  auVar251._0_4_ = auVar64._0_4_ * fVar250;
  auVar251._4_4_ = auVar64._4_4_ * fVar233;
  auVar251._8_4_ = auVar64._8_4_ * fVar245;
  auVar251._12_4_ = auVar64._12_4_ * fVar246;
  auVar63 = vfmadd231ps_fma(auVar251,(undefined1  [16])aVar5,auVar63);
  auVar85 = vfmadd231ps_fma(auVar63,(undefined1  [16])aVar4,auVar215);
  local_500 = vsubps_avx512vl(_local_580,auVar62);
  uVar130 = local_500._0_4_;
  auVar216._4_4_ = uVar130;
  auVar216._0_4_ = uVar130;
  auVar216._8_4_ = uVar130;
  auVar216._12_4_ = uVar130;
  auVar63 = vshufps_avx(local_500,local_500,0x55);
  auVar64 = vshufps_avx(local_500,local_500,0xaa);
  auVar258._0_4_ = auVar64._0_4_ * fVar250;
  auVar258._4_4_ = auVar64._4_4_ * fVar233;
  auVar258._8_4_ = auVar64._8_4_ * fVar245;
  auVar258._12_4_ = auVar64._12_4_ * fVar246;
  auVar63 = vfmadd231ps_fma(auVar258,(undefined1  [16])aVar5,auVar63);
  auVar84 = vfmadd231ps_fma(auVar63,(undefined1  [16])aVar4,auVar216);
  local_510 = vsubps_avx(_local_590,auVar62);
  uVar130 = local_510._0_4_;
  auVar166._4_4_ = uVar130;
  auVar166._0_4_ = uVar130;
  auVar166._8_4_ = uVar130;
  auVar166._12_4_ = uVar130;
  auVar62 = vshufps_avx(local_510,local_510,0x55);
  auVar63 = vshufps_avx(local_510,local_510,0xaa);
  auVar200._0_4_ = auVar63._0_4_ * fVar250;
  auVar200._4_4_ = auVar63._4_4_ * fVar233;
  auVar200._8_4_ = auVar63._8_4_ * fVar245;
  auVar200._12_4_ = auVar63._12_4_ * fVar246;
  auVar62 = vfmadd231ps_fma(auVar200,(undefined1  [16])aVar5,auVar62);
  auVar83 = vfmadd231ps_fma(auVar62,(undefined1  [16])aVar4,auVar166);
  auVar74 = vmovlhps_avx512f(auVar75,auVar81);
  auVar64 = vmovlhps_avx(auVar76,auVar85);
  auVar71 = vmovlhps_avx(auVar79,auVar84);
  _local_680 = vmovlhps_avx(auVar80,auVar83);
  auVar63 = vminps_avx512vl(auVar74,auVar64);
  auVar77 = vmaxps_avx512vl(auVar74,auVar64);
  auVar62 = vminps_avx(auVar71,_local_680);
  auVar63 = vminps_avx(auVar63,auVar62);
  auVar62 = vmaxps_avx(auVar71,_local_680);
  auVar62 = vmaxps_avx(auVar77,auVar62);
  auVar77 = vshufpd_avx(auVar63,auVar63,3);
  auVar63 = vminps_avx(auVar63,auVar77);
  auVar77 = vshufpd_avx(auVar62,auVar62,3);
  auVar62 = vmaxps_avx(auVar62,auVar77);
  auVar63 = vandps_avx512vl(auVar63,auVar286._0_16_);
  auVar62 = vandps_avx512vl(auVar62,auVar286._0_16_);
  auVar62 = vmaxps_avx(auVar63,auVar62);
  auVar63 = vmovshdup_avx(auVar62);
  auVar62 = vmaxss_avx(auVar63,auVar62);
  local_600 = vmovddup_avx512vl(auVar75);
  local_610 = vmovddup_avx512vl(auVar76);
  local_620 = vmovddup_avx512vl(auVar79);
  local_630._0_8_ = auVar80._0_8_;
  local_630._8_8_ = local_630._0_8_;
  register0x00001308 = auVar81._0_8_;
  local_640 = auVar81._0_8_;
  register0x00001348 = auVar85._0_8_;
  local_650 = auVar85._0_8_;
  register0x00001488 = auVar84._0_8_;
  local_660 = auVar84._0_8_;
  local_670 = auVar83._0_8_;
  register0x000013c8 = local_670;
  local_690 = ZEXT416((uint)(auVar62._0_4_ * 9.536743e-07));
  local_3e0 = vbroadcastss_avx512vl(local_690);
  auVar62 = vxorps_avx512vl(local_3e0._0_16_,auVar82);
  local_3c0 = auVar62._0_4_;
  uStack_3bc = local_3c0;
  uStack_3b8 = local_3c0;
  uStack_3b4 = local_3c0;
  uStack_3b0 = local_3c0;
  uStack_3ac = local_3c0;
  uStack_3a8 = local_3c0;
  uStack_3a4 = local_3c0;
  uVar53 = 0;
  local_470 = vsubps_avx512vl(auVar64,auVar74);
  local_480 = vsubps_avx(auVar71,auVar64);
  local_490 = vsubps_avx(_local_680,auVar71);
  local_5a0 = vsubps_avx512vl(_local_560,local_520);
  local_5b0 = vsubps_avx512vl(_local_570,local_530);
  local_5c0 = vsubps_avx512vl(_local_580,local_540);
  _local_5d0 = vsubps_avx(_local_590,local_550);
  auVar111 = vpbroadcastd_avx512f();
  local_300 = vmovdqa64_avx512f(auVar111);
  auVar111 = vpbroadcastd_avx512f();
  local_340 = vmovdqa64_avx512f(auVar111);
  auVar62 = ZEXT816(0x3f80000000000000);
  auVar284 = ZEXT1664(auVar62);
  auVar112._32_32_ = auVar111._32_32_;
  do {
    auVar85 = auVar284._0_16_;
    auVar77 = vshufps_avx512vl(auVar85,auVar85,0x50);
    auVar270._8_4_ = 0x3f800000;
    auVar270._0_8_ = &DAT_3f8000003f800000;
    auVar270._12_4_ = 0x3f800000;
    auVar106._16_4_ = 0x3f800000;
    auVar106._0_16_ = auVar270;
    auVar106._20_4_ = 0x3f800000;
    auVar106._24_4_ = 0x3f800000;
    auVar106._28_4_ = 0x3f800000;
    auVar63 = vsubps_avx(auVar270,auVar77);
    fVar250 = auVar77._0_4_;
    auVar155._0_4_ = local_640._0_4_ * fVar250;
    fVar233 = auVar77._4_4_;
    auVar155._4_4_ = local_640._4_4_ * fVar233;
    fVar245 = auVar77._8_4_;
    auVar155._8_4_ = local_640._8_4_ * fVar245;
    fVar246 = auVar77._12_4_;
    auVar155._12_4_ = local_640._12_4_ * fVar246;
    auVar167._0_4_ = local_650._0_4_ * fVar250;
    auVar167._4_4_ = local_650._4_4_ * fVar233;
    auVar167._8_4_ = local_650._8_4_ * fVar245;
    auVar167._12_4_ = local_650._12_4_ * fVar246;
    auVar179._0_4_ = local_660._0_4_ * fVar250;
    auVar179._4_4_ = local_660._4_4_ * fVar233;
    auVar179._8_4_ = local_660._8_4_ * fVar245;
    auVar179._12_4_ = local_660._12_4_ * fVar246;
    auVar139._0_4_ = local_670._0_4_ * fVar250;
    auVar139._4_4_ = local_670._4_4_ * fVar233;
    auVar139._8_4_ = local_670._8_4_ * fVar245;
    auVar139._12_4_ = local_670._12_4_ * fVar246;
    auVar75 = vfmadd231ps_avx512vl(auVar155,auVar63,local_600);
    auVar76 = vfmadd231ps_avx512vl(auVar167,auVar63,local_610);
    auVar79 = vfmadd231ps_avx512vl(auVar179,auVar63,local_620);
    auVar77 = vfmadd231ps_fma(auVar139,local_630,auVar63);
    auVar63 = vmovshdup_avx(auVar62);
    fVar233 = auVar62._0_4_;
    fVar250 = (auVar63._0_4_ - fVar233) * 0.04761905;
    auVar99._4_4_ = fVar233;
    auVar99._0_4_ = fVar233;
    auVar99._8_4_ = fVar233;
    auVar99._12_4_ = fVar233;
    auVar99._16_4_ = fVar233;
    auVar99._20_4_ = fVar233;
    auVar99._24_4_ = fVar233;
    auVar99._28_4_ = fVar233;
    auVar90._0_8_ = auVar63._0_8_;
    auVar90._8_8_ = auVar90._0_8_;
    auVar90._16_8_ = auVar90._0_8_;
    auVar90._24_8_ = auVar90._0_8_;
    auVar102 = vsubps_avx(auVar90,auVar99);
    uVar130 = auVar75._0_4_;
    auVar104._4_4_ = uVar130;
    auVar104._0_4_ = uVar130;
    auVar104._8_4_ = uVar130;
    auVar104._12_4_ = uVar130;
    auVar104._16_4_ = uVar130;
    auVar104._20_4_ = uVar130;
    auVar104._24_4_ = uVar130;
    auVar104._28_4_ = uVar130;
    auVar92._8_4_ = 1;
    auVar92._0_8_ = 0x100000001;
    auVar92._12_4_ = 1;
    auVar92._16_4_ = 1;
    auVar92._20_4_ = 1;
    auVar92._24_4_ = 1;
    auVar92._28_4_ = 1;
    auVar101 = ZEXT1632(auVar75);
    auVar100 = vpermps_avx2(auVar92,auVar101);
    auVar86 = vbroadcastss_avx512vl(auVar76);
    auVar103 = ZEXT1632(auVar76);
    auVar87 = vpermps_avx512vl(auVar92,auVar103);
    auVar88 = vbroadcastss_avx512vl(auVar79);
    auVar96 = ZEXT1632(auVar79);
    auVar89 = vpermps_avx512vl(auVar92,auVar96);
    auVar90 = vbroadcastss_avx512vl(auVar77);
    auVar98 = ZEXT1632(auVar77);
    auVar91 = vpermps_avx512vl(auVar92,auVar98);
    auVar105._4_4_ = fVar250;
    auVar105._0_4_ = fVar250;
    auVar105._8_4_ = fVar250;
    auVar105._12_4_ = fVar250;
    auVar105._16_4_ = fVar250;
    auVar105._20_4_ = fVar250;
    auVar105._24_4_ = fVar250;
    auVar105._28_4_ = fVar250;
    auVar97._8_4_ = 2;
    auVar97._0_8_ = 0x200000002;
    auVar97._12_4_ = 2;
    auVar97._16_4_ = 2;
    auVar97._20_4_ = 2;
    auVar97._24_4_ = 2;
    auVar97._28_4_ = 2;
    auVar92 = vpermps_avx512vl(auVar97,auVar101);
    auVar93 = vbroadcastss_avx512vl(ZEXT416(3));
    auVar94 = vpermps_avx512vl(auVar93,auVar101);
    auVar101 = vpermps_avx2(auVar97,auVar103);
    auVar95 = vpermps_avx512vl(auVar93,auVar103);
    auVar103 = vpermps_avx2(auVar97,auVar96);
    auVar96 = vpermps_avx512vl(auVar93,auVar96);
    auVar97 = vpermps_avx512vl(auVar97,auVar98);
    auVar93 = vpermps_avx512vl(auVar93,auVar98);
    auVar63 = vfmadd132ps_fma(auVar102,auVar99,_DAT_02020f20);
    auVar102 = vsubps_avx(auVar106,ZEXT1632(auVar63));
    auVar98 = vmulps_avx512vl(auVar86,ZEXT1632(auVar63));
    auVar106 = ZEXT1632(auVar63);
    auVar99 = vmulps_avx512vl(auVar87,auVar106);
    auVar77 = vfmadd231ps_fma(auVar98,auVar102,auVar104);
    auVar75 = vfmadd231ps_fma(auVar99,auVar102,auVar100);
    auVar98 = vmulps_avx512vl(auVar88,auVar106);
    auVar99 = vmulps_avx512vl(auVar89,auVar106);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar102,auVar86);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar102,auVar87);
    auVar86 = vmulps_avx512vl(auVar90,auVar106);
    auVar104 = ZEXT1632(auVar63);
    auVar87 = vmulps_avx512vl(auVar91,auVar104);
    auVar88 = vfmadd231ps_avx512vl(auVar86,auVar102,auVar88);
    auVar89 = vfmadd231ps_avx512vl(auVar87,auVar102,auVar89);
    fVar245 = auVar63._0_4_;
    fVar246 = auVar63._4_4_;
    auVar86._4_4_ = fVar246 * auVar98._4_4_;
    auVar86._0_4_ = fVar245 * auVar98._0_4_;
    fVar247 = auVar63._8_4_;
    auVar86._8_4_ = fVar247 * auVar98._8_4_;
    fVar248 = auVar63._12_4_;
    auVar86._12_4_ = fVar248 * auVar98._12_4_;
    auVar86._16_4_ = auVar98._16_4_ * 0.0;
    auVar86._20_4_ = auVar98._20_4_ * 0.0;
    auVar86._24_4_ = auVar98._24_4_ * 0.0;
    auVar86._28_4_ = fVar233;
    auVar87._4_4_ = fVar246 * auVar99._4_4_;
    auVar87._0_4_ = fVar245 * auVar99._0_4_;
    auVar87._8_4_ = fVar247 * auVar99._8_4_;
    auVar87._12_4_ = fVar248 * auVar99._12_4_;
    auVar87._16_4_ = auVar99._16_4_ * 0.0;
    auVar87._20_4_ = auVar99._20_4_ * 0.0;
    auVar87._24_4_ = auVar99._24_4_ * 0.0;
    auVar87._28_4_ = auVar100._28_4_;
    auVar77 = vfmadd231ps_fma(auVar86,auVar102,ZEXT1632(auVar77));
    auVar75 = vfmadd231ps_fma(auVar87,auVar102,ZEXT1632(auVar75));
    auVar91._0_4_ = fVar245 * auVar88._0_4_;
    auVar91._4_4_ = fVar246 * auVar88._4_4_;
    auVar91._8_4_ = fVar247 * auVar88._8_4_;
    auVar91._12_4_ = fVar248 * auVar88._12_4_;
    auVar91._16_4_ = auVar88._16_4_ * 0.0;
    auVar91._20_4_ = auVar88._20_4_ * 0.0;
    auVar91._24_4_ = auVar88._24_4_ * 0.0;
    auVar91._28_4_ = 0;
    auVar100._4_4_ = fVar246 * auVar89._4_4_;
    auVar100._0_4_ = fVar245 * auVar89._0_4_;
    auVar100._8_4_ = fVar247 * auVar89._8_4_;
    auVar100._12_4_ = fVar248 * auVar89._12_4_;
    auVar100._16_4_ = auVar89._16_4_ * 0.0;
    auVar100._20_4_ = auVar89._20_4_ * 0.0;
    auVar100._24_4_ = auVar89._24_4_ * 0.0;
    auVar100._28_4_ = auVar88._28_4_;
    auVar76 = vfmadd231ps_fma(auVar91,auVar102,auVar98);
    auVar79 = vfmadd231ps_fma(auVar100,auVar102,auVar99);
    auVar88._28_4_ = auVar99._28_4_;
    auVar88._0_28_ =
         ZEXT1628(CONCAT412(fVar248 * auVar79._12_4_,
                            CONCAT48(fVar247 * auVar79._8_4_,
                                     CONCAT44(fVar246 * auVar79._4_4_,fVar245 * auVar79._0_4_))));
    auVar80 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar248 * auVar76._12_4_,
                                                 CONCAT48(fVar247 * auVar76._8_4_,
                                                          CONCAT44(fVar246 * auVar76._4_4_,
                                                                   fVar245 * auVar76._0_4_)))),
                              auVar102,ZEXT1632(auVar77));
    auVar81 = vfmadd231ps_fma(auVar88,auVar102,ZEXT1632(auVar75));
    auVar100 = vsubps_avx(ZEXT1632(auVar76),ZEXT1632(auVar77));
    auVar86 = vsubps_avx(ZEXT1632(auVar79),ZEXT1632(auVar75));
    auVar87 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar100 = vmulps_avx512vl(auVar100,auVar87);
    auVar86 = vmulps_avx512vl(auVar86,auVar87);
    auVar98._0_4_ = fVar250 * auVar100._0_4_;
    auVar98._4_4_ = fVar250 * auVar100._4_4_;
    auVar98._8_4_ = fVar250 * auVar100._8_4_;
    auVar98._12_4_ = fVar250 * auVar100._12_4_;
    auVar98._16_4_ = fVar250 * auVar100._16_4_;
    auVar98._20_4_ = fVar250 * auVar100._20_4_;
    auVar98._24_4_ = fVar250 * auVar100._24_4_;
    auVar98._28_4_ = 0;
    auVar100 = vmulps_avx512vl(auVar105,auVar86);
    auVar76 = vxorps_avx512vl(auVar90._0_16_,auVar90._0_16_);
    auVar86 = vpermt2ps_avx512vl(ZEXT1632(auVar80),_DAT_0205fd20,ZEXT1632(auVar76));
    auVar88 = vpermt2ps_avx512vl(ZEXT1632(auVar81),_DAT_0205fd20,ZEXT1632(auVar76));
    auVar145._0_4_ = auVar98._0_4_ + auVar80._0_4_;
    auVar145._4_4_ = auVar98._4_4_ + auVar80._4_4_;
    auVar145._8_4_ = auVar98._8_4_ + auVar80._8_4_;
    auVar145._12_4_ = auVar98._12_4_ + auVar80._12_4_;
    auVar145._16_4_ = auVar98._16_4_ + 0.0;
    auVar145._20_4_ = auVar98._20_4_ + 0.0;
    auVar145._24_4_ = auVar98._24_4_ + 0.0;
    auVar145._28_4_ = 0;
    auVar99 = ZEXT1632(auVar76);
    auVar89 = vpermt2ps_avx512vl(auVar98,_DAT_0205fd20,auVar99);
    auVar90 = vaddps_avx512vl(ZEXT1632(auVar81),auVar100);
    auVar91 = vpermt2ps_avx512vl(auVar100,_DAT_0205fd20,auVar99);
    auVar100 = vsubps_avx(auVar86,auVar89);
    auVar91 = vsubps_avx512vl(auVar88,auVar91);
    auVar89 = vmulps_avx512vl(auVar101,auVar104);
    auVar98 = vmulps_avx512vl(auVar95,auVar104);
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar102,auVar92);
    auVar92 = vfmadd231ps_avx512vl(auVar98,auVar102,auVar94);
    auVar94 = vmulps_avx512vl(auVar103,auVar104);
    auVar98 = vmulps_avx512vl(auVar96,auVar104);
    auVar101 = vfmadd231ps_avx512vl(auVar94,auVar102,auVar101);
    auVar94 = vfmadd231ps_avx512vl(auVar98,auVar102,auVar95);
    auVar95 = vmulps_avx512vl(auVar97,auVar104);
    auVar93 = vmulps_avx512vl(auVar93,auVar104);
    auVar77 = vfmadd231ps_fma(auVar95,auVar102,auVar103);
    auVar75 = vfmadd231ps_fma(auVar93,auVar102,auVar96);
    auVar93 = vmulps_avx512vl(auVar104,auVar101);
    auVar95 = vmulps_avx512vl(ZEXT1632(auVar63),auVar94);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar102,auVar89);
    auVar92 = vfmadd231ps_avx512vl(auVar95,auVar102,auVar92);
    auVar95 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar248 * auVar77._12_4_,
                                            CONCAT48(fVar247 * auVar77._8_4_,
                                                     CONCAT44(fVar246 * auVar77._4_4_,
                                                              fVar245 * auVar77._0_4_)))),auVar102,
                         auVar101);
    auVar94 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar248 * auVar75._12_4_,
                                            CONCAT48(fVar247 * auVar75._8_4_,
                                                     CONCAT44(fVar246 * auVar75._4_4_,
                                                              fVar245 * auVar75._0_4_)))),auVar102,
                         auVar94);
    auVar101._4_4_ = fVar246 * auVar95._4_4_;
    auVar101._0_4_ = fVar245 * auVar95._0_4_;
    auVar101._8_4_ = fVar247 * auVar95._8_4_;
    auVar101._12_4_ = fVar248 * auVar95._12_4_;
    auVar101._16_4_ = auVar95._16_4_ * 0.0;
    auVar101._20_4_ = auVar95._20_4_ * 0.0;
    auVar101._24_4_ = auVar95._24_4_ * 0.0;
    auVar101._28_4_ = auVar96._28_4_;
    auVar89._4_4_ = fVar246 * auVar94._4_4_;
    auVar89._0_4_ = fVar245 * auVar94._0_4_;
    auVar89._8_4_ = fVar247 * auVar94._8_4_;
    auVar89._12_4_ = fVar248 * auVar94._12_4_;
    auVar89._16_4_ = auVar94._16_4_ * 0.0;
    auVar89._20_4_ = auVar94._20_4_ * 0.0;
    auVar89._24_4_ = auVar94._24_4_ * 0.0;
    auVar89._28_4_ = auVar103._28_4_;
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar102,auVar93);
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar92,auVar102);
    auVar102 = vsubps_avx512vl(auVar95,auVar93);
    auVar103 = vsubps_avx512vl(auVar94,auVar92);
    auVar92 = vmulps_avx512vl(auVar102,auVar87);
    auVar103 = vmulps_avx512vl(auVar103,auVar87);
    fVar233 = fVar250 * auVar92._0_4_;
    fVar245 = fVar250 * auVar92._4_4_;
    auVar102._4_4_ = fVar245;
    auVar102._0_4_ = fVar233;
    fVar246 = fVar250 * auVar92._8_4_;
    auVar102._8_4_ = fVar246;
    fVar247 = fVar250 * auVar92._12_4_;
    auVar102._12_4_ = fVar247;
    fVar248 = fVar250 * auVar92._16_4_;
    auVar102._16_4_ = fVar248;
    fVar249 = fVar250 * auVar92._20_4_;
    auVar102._20_4_ = fVar249;
    fVar250 = fVar250 * auVar92._24_4_;
    auVar102._24_4_ = fVar250;
    auVar102._28_4_ = auVar92._28_4_;
    auVar103 = vmulps_avx512vl(auVar105,auVar103);
    auVar87 = vpermt2ps_avx512vl(auVar101,_DAT_0205fd20,auVar99);
    auVar93 = vpermt2ps_avx512vl(auVar89,_DAT_0205fd20,auVar99);
    auVar232._0_4_ = auVar101._0_4_ + fVar233;
    auVar232._4_4_ = auVar101._4_4_ + fVar245;
    auVar232._8_4_ = auVar101._8_4_ + fVar246;
    auVar232._12_4_ = auVar101._12_4_ + fVar247;
    auVar232._16_4_ = auVar101._16_4_ + fVar248;
    auVar232._20_4_ = auVar101._20_4_ + fVar249;
    auVar232._24_4_ = auVar101._24_4_ + fVar250;
    auVar232._28_4_ = auVar101._28_4_ + auVar92._28_4_;
    auVar102 = vpermt2ps_avx512vl(auVar102,_DAT_0205fd20,ZEXT1632(auVar76));
    auVar92 = vaddps_avx512vl(auVar89,auVar103);
    auVar103 = vpermt2ps_avx512vl(auVar103,_DAT_0205fd20,ZEXT1632(auVar76));
    auVar102 = vsubps_avx(auVar87,auVar102);
    auVar94 = vsubps_avx512vl(auVar93,auVar103);
    auVar162 = ZEXT1632(auVar80);
    auVar103 = vsubps_avx512vl(auVar101,auVar162);
    auVar171 = ZEXT1632(auVar81);
    auVar95 = vsubps_avx512vl(auVar89,auVar171);
    auVar96 = vsubps_avx512vl(auVar87,auVar86);
    auVar103 = vaddps_avx512vl(auVar103,auVar96);
    auVar96 = vsubps_avx512vl(auVar93,auVar88);
    auVar95 = vaddps_avx512vl(auVar95,auVar96);
    auVar96 = vmulps_avx512vl(auVar171,auVar103);
    auVar96 = vfnmadd231ps_avx512vl(auVar96,auVar162,auVar95);
    auVar97 = vmulps_avx512vl(auVar90,auVar103);
    auVar97 = vfnmadd231ps_avx512vl(auVar97,auVar145,auVar95);
    auVar98 = vmulps_avx512vl(auVar91,auVar103);
    auVar98 = vfnmadd231ps_avx512vl(auVar98,auVar100,auVar95);
    auVar99 = vmulps_avx512vl(auVar88,auVar103);
    auVar99 = vfnmadd231ps_avx512vl(auVar99,auVar86,auVar95);
    auVar104 = vmulps_avx512vl(auVar89,auVar103);
    auVar104 = vfnmadd231ps_avx512vl(auVar104,auVar101,auVar95);
    auVar105 = vmulps_avx512vl(auVar92,auVar103);
    auVar105 = vfnmadd231ps_avx512vl(auVar105,auVar232,auVar95);
    auVar106 = vmulps_avx512vl(auVar94,auVar103);
    auVar106 = vfnmadd231ps_avx512vl(auVar106,auVar102,auVar95);
    auVar103 = vmulps_avx512vl(auVar93,auVar103);
    auVar103 = vfnmadd231ps_avx512vl(auVar103,auVar87,auVar95);
    auVar95 = vminps_avx512vl(auVar96,auVar97);
    auVar96 = vmaxps_avx512vl(auVar96,auVar97);
    auVar97 = vminps_avx512vl(auVar98,auVar99);
    auVar95 = vminps_avx512vl(auVar95,auVar97);
    auVar97 = vmaxps_avx512vl(auVar98,auVar99);
    auVar96 = vmaxps_avx512vl(auVar96,auVar97);
    auVar97 = vminps_avx512vl(auVar104,auVar105);
    auVar98 = vmaxps_avx512vl(auVar104,auVar105);
    auVar99 = vminps_avx512vl(auVar106,auVar103);
    auVar97 = vminps_avx512vl(auVar97,auVar99);
    auVar95 = vminps_avx512vl(auVar95,auVar97);
    auVar103 = vmaxps_avx512vl(auVar106,auVar103);
    auVar103 = vmaxps_avx512vl(auVar98,auVar103);
    auVar96 = vmaxps_avx512vl(auVar96,auVar103);
    uVar31 = vcmpps_avx512vl(auVar95,local_3e0,2);
    auVar103._4_4_ = uStack_3bc;
    auVar103._0_4_ = local_3c0;
    auVar103._8_4_ = uStack_3b8;
    auVar103._12_4_ = uStack_3b4;
    auVar103._16_4_ = uStack_3b0;
    auVar103._20_4_ = uStack_3ac;
    auVar103._24_4_ = uStack_3a8;
    auVar103._28_4_ = uStack_3a4;
    uVar32 = vcmpps_avx512vl(auVar96,auVar103,5);
    uVar59 = 0;
    bVar51 = (byte)uVar31 & (byte)uVar32 & 0x7f;
    if (bVar51 != 0) {
      auVar95 = vsubps_avx512vl(auVar86,auVar162);
      auVar96 = vsubps_avx512vl(auVar88,auVar171);
      auVar97 = vsubps_avx512vl(auVar87,auVar101);
      auVar95 = vaddps_avx512vl(auVar95,auVar97);
      auVar97 = vsubps_avx512vl(auVar93,auVar89);
      auVar96 = vaddps_avx512vl(auVar96,auVar97);
      auVar97 = vmulps_avx512vl(auVar171,auVar95);
      auVar97 = vfnmadd231ps_avx512vl(auVar97,auVar96,auVar162);
      auVar90 = vmulps_avx512vl(auVar90,auVar95);
      auVar90 = vfnmadd213ps_avx512vl(auVar145,auVar96,auVar90);
      auVar91 = vmulps_avx512vl(auVar91,auVar95);
      auVar91 = vfnmadd213ps_avx512vl(auVar100,auVar96,auVar91);
      auVar100 = vmulps_avx512vl(auVar88,auVar95);
      auVar88 = vfnmadd231ps_avx512vl(auVar100,auVar96,auVar86);
      auVar100 = vmulps_avx512vl(auVar89,auVar95);
      auVar89 = vfnmadd231ps_avx512vl(auVar100,auVar96,auVar101);
      auVar100 = vmulps_avx512vl(auVar92,auVar95);
      auVar92 = vfnmadd213ps_avx512vl(auVar232,auVar96,auVar100);
      auVar100 = vmulps_avx512vl(auVar94,auVar95);
      auVar94 = vfnmadd213ps_avx512vl(auVar102,auVar96,auVar100);
      auVar102 = vmulps_avx512vl(auVar93,auVar95);
      auVar93 = vfnmadd231ps_avx512vl(auVar102,auVar87,auVar96);
      auVar100 = vminps_avx(auVar97,auVar90);
      auVar102 = vmaxps_avx(auVar97,auVar90);
      auVar86 = vminps_avx(auVar91,auVar88);
      auVar86 = vminps_avx(auVar100,auVar86);
      auVar100 = vmaxps_avx(auVar91,auVar88);
      auVar102 = vmaxps_avx(auVar102,auVar100);
      auVar101 = vminps_avx(auVar89,auVar92);
      auVar100 = vmaxps_avx(auVar89,auVar92);
      auVar87 = vminps_avx(auVar94,auVar93);
      auVar101 = vminps_avx(auVar101,auVar87);
      auVar101 = vminps_avx(auVar86,auVar101);
      auVar86 = vmaxps_avx(auVar94,auVar93);
      auVar100 = vmaxps_avx(auVar100,auVar86);
      auVar102 = vmaxps_avx(auVar102,auVar100);
      uVar31 = vcmpps_avx512vl(auVar102,auVar103,5);
      uVar32 = vcmpps_avx512vl(auVar101,local_3e0,2);
      uVar59 = (uint)(bVar51 & (byte)uVar31 & (byte)uVar32);
    }
    if (uVar59 != 0) {
      auStack_5f0[uVar53] = uVar59;
      uVar31 = vmovlps_avx(auVar62);
      *(undefined8 *)(&uStack_460 + uVar53 * 2) = uVar31;
      uVar3 = vmovlps_avx(auVar85);
      auStack_3a0[uVar53] = uVar3;
      uVar53 = (ulong)((int)uVar53 + 1);
    }
    auVar62 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar135 = ZEXT1664(auVar62);
    auVar111._0_32_ = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar111._32_32_ = auVar112._32_32_;
    auVar285 = ZEXT3264(auVar111._0_32_);
    in_ZMM19 = ZEXT464(0x3e2aaaab);
    in_ZMM22 = ZEXT464(0x38d1b717);
    do {
      auVar63 = auVar135._0_16_;
      auVar75 = auVar290._0_16_;
      auVar62 = SUB6416(ZEXT464(0xb8d1b717),0);
      auVar77 = SUB6416(ZEXT464(0x38d1b717),0);
      if ((int)uVar53 == 0) {
        uVar130 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar36._4_4_ = uVar130;
        auVar36._0_4_ = uVar130;
        auVar36._8_4_ = uVar130;
        auVar36._12_4_ = uVar130;
        uVar31 = vcmpps_avx512vl(local_5e0,auVar36,2);
        uVar60 = (uint)uVar61 & (uint)uVar61 + 0xf & (uint)uVar31;
        uVar61 = (ulong)uVar60;
        if (uVar60 == 0) {
          return;
        }
        goto LAB_01c28f73;
      }
      uVar52 = (int)uVar53 - 1;
      uVar54 = (ulong)uVar52;
      uVar59 = (&uStack_460)[uVar54 * 2];
      fVar250 = afStack_45c[uVar54 * 2];
      uVar8 = auStack_5f0[uVar54];
      uVar3 = auStack_3a0[uVar54];
      auVar284 = ZEXT864(uVar3);
      lVar56 = 0;
      for (uVar58 = (ulong)uVar8; (uVar58 & 1) == 0; uVar58 = uVar58 >> 1 | 0x8000000000000000) {
        lVar56 = lVar56 + 1;
      }
      uVar57 = uVar8 - 1 & uVar8;
      auStack_5f0[uVar54] = uVar57;
      if (uVar57 == 0) {
        uVar53 = (ulong)uVar52;
      }
      auVar150._0_4_ = (float)lVar56;
      auVar150._4_8_ = SUB128(ZEXT812(0),4);
      auVar150._12_4_ = 0;
      auVar112._32_32_ = auVar111._32_32_;
      auVar76 = vmulss_avx512f(auVar150,SUB6416(ZEXT464(0x3e124925),0));
      lVar56 = lVar56 + 1;
      auVar79 = vmulss_avx512f(ZEXT416((uint)(float)lVar56),SUB6416(ZEXT464(0x3e124925),0));
      auVar81 = auVar288._0_16_;
      auVar80 = vsubss_avx512f(auVar81,auVar76);
      auVar76 = vmulss_avx512f(ZEXT416((uint)fVar250),auVar76);
      auVar125._0_16_ = vfmadd231ss_avx512f(auVar76,ZEXT416(uVar59),auVar80);
      auVar76 = vsubss_avx512f(auVar81,auVar79);
      auVar79 = vfmadd231ss_fma(ZEXT416((uint)(fVar250 * auVar79._0_4_)),ZEXT416(uVar59),auVar76);
      auVar80 = vsubss_avx512f(auVar79,auVar125._0_16_);
      auVar76 = vucomiss_avx512f(auVar80);
      in_ZMM19 = ZEXT1664(auVar76);
      if (uVar8 == 0 || lVar56 == 0) break;
      auVar282._8_8_ = 0;
      auVar282._0_8_ = uVar3;
      auVar76 = vshufps_avx512vl(auVar282,auVar282,0x50);
      vucomiss_avx512f(auVar80);
      uVar59 = (uint)uVar53;
      auVar146 = auVar287._0_16_;
      auVar83 = vsubps_avx512vl(auVar146,auVar76);
      fVar250 = auVar76._0_4_;
      auVar156._0_4_ = fVar250 * (float)local_640._0_4_;
      fVar233 = auVar76._4_4_;
      auVar156._4_4_ = fVar233 * (float)local_640._4_4_;
      fVar245 = auVar76._8_4_;
      auVar156._8_4_ = fVar245 * fStack_638;
      fVar246 = auVar76._12_4_;
      auVar156._12_4_ = fVar246 * fStack_634;
      auVar168._0_4_ = fVar250 * (float)local_650._0_4_;
      auVar168._4_4_ = fVar233 * (float)local_650._4_4_;
      auVar168._8_4_ = fVar245 * fStack_648;
      auVar168._12_4_ = fVar246 * fStack_644;
      auVar180._0_4_ = fVar250 * (float)local_660._0_4_;
      auVar180._4_4_ = fVar233 * (float)local_660._4_4_;
      auVar180._8_4_ = fVar245 * fStack_658;
      auVar180._12_4_ = fVar246 * fStack_654;
      auVar140._0_4_ = fVar250 * (float)local_670._0_4_;
      auVar140._4_4_ = fVar233 * (float)local_670._4_4_;
      auVar140._8_4_ = fVar245 * fStack_668;
      auVar140._12_4_ = fVar246 * fStack_664;
      auVar76 = vfmadd231ps_fma(auVar156,auVar83,local_600);
      auVar85 = vfmadd231ps_fma(auVar168,auVar83,local_610);
      auVar84 = vfmadd231ps_fma(auVar180,auVar83,local_620);
      auVar83 = vfmadd231ps_fma(auVar140,auVar83,local_630);
      auVar93._16_16_ = auVar76;
      auVar93._0_16_ = auVar76;
      auVar94._16_16_ = auVar85;
      auVar94._0_16_ = auVar85;
      auVar96._16_16_ = auVar84;
      auVar96._0_16_ = auVar84;
      auVar76 = vbroadcastss_avx512vl(auVar125._0_16_);
      uVar130 = auVar79._0_4_;
      auVar162._20_4_ = uVar130;
      auVar162._16_4_ = uVar130;
      auVar162._24_4_ = uVar130;
      auVar162._28_4_ = uVar130;
      auVar162._0_16_ = auVar76;
      auVar102 = vsubps_avx(auVar94,auVar93);
      auVar85 = vfmadd213ps_fma(auVar102,auVar162,auVar93);
      auVar102 = vsubps_avx(auVar96,auVar94);
      auVar82 = vfmadd213ps_fma(auVar102,auVar162,auVar94);
      auVar76 = vsubps_avx(auVar83,auVar84);
      auVar95._16_16_ = auVar76;
      auVar95._0_16_ = auVar76;
      auVar76 = vfmadd213ps_fma(auVar95,auVar162,auVar96);
      auVar102 = vsubps_avx(ZEXT1632(auVar82),ZEXT1632(auVar85));
      auVar85 = vfmadd213ps_fma(auVar102,auVar162,ZEXT1632(auVar85));
      auVar102 = vsubps_avx(ZEXT1632(auVar76),ZEXT1632(auVar82));
      auVar76 = vfmadd213ps_fma(auVar102,auVar162,ZEXT1632(auVar82));
      auVar102 = vsubps_avx(ZEXT1632(auVar76),ZEXT1632(auVar85));
      auVar78 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar102,auVar162);
      auVar112._0_32_ = vmulps_avx512vl(auVar102,auVar285._0_32_);
      auVar111._16_48_ = auVar112._16_48_;
      auVar111._0_16_ = vmulss_avx512f(auVar80,SUB6416(ZEXT464(0x3eaaaaab),0));
      fVar250 = auVar111._0_4_;
      auVar181._0_8_ =
           CONCAT44(auVar78._4_4_ + fVar250 * auVar112._4_4_,
                    auVar78._0_4_ + fVar250 * auVar112._0_4_);
      auVar181._8_4_ = auVar78._8_4_ + fVar250 * auVar112._8_4_;
      auVar181._12_4_ = auVar78._12_4_ + fVar250 * auVar112._12_4_;
      auVar157._0_4_ = fVar250 * auVar112._16_4_;
      auVar157._4_4_ = fVar250 * auVar112._20_4_;
      auVar157._8_4_ = fVar250 * auVar112._24_4_;
      auVar157._12_4_ = fVar250 * auVar112._28_4_;
      auVar72 = vsubps_avx((undefined1  [16])0x0,auVar157);
      auVar66 = vshufpd_avx(auVar78,auVar78,3);
      auVar67 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar76 = vsubps_avx(auVar66,auVar78);
      auVar85 = vsubps_avx(auVar67,(undefined1  [16])0x0);
      auVar201._0_4_ = auVar85._0_4_ + auVar76._0_4_;
      auVar201._4_4_ = auVar85._4_4_ + auVar76._4_4_;
      auVar201._8_4_ = auVar85._8_4_ + auVar76._8_4_;
      auVar201._12_4_ = auVar85._12_4_ + auVar76._12_4_;
      auVar76 = vshufps_avx(auVar78,auVar78,0xb1);
      auVar85 = vshufps_avx(auVar181,auVar181,0xb1);
      auVar84 = vshufps_avx(auVar72,auVar72,0xb1);
      auVar83 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar259._4_4_ = auVar201._0_4_;
      auVar259._0_4_ = auVar201._0_4_;
      auVar259._8_4_ = auVar201._0_4_;
      auVar259._12_4_ = auVar201._0_4_;
      auVar82 = vshufps_avx(auVar201,auVar201,0x55);
      fVar250 = auVar82._0_4_;
      auVar217._0_4_ = auVar76._0_4_ * fVar250;
      fVar233 = auVar82._4_4_;
      auVar217._4_4_ = auVar76._4_4_ * fVar233;
      fVar245 = auVar82._8_4_;
      auVar217._8_4_ = auVar76._8_4_ * fVar245;
      fVar246 = auVar82._12_4_;
      auVar217._12_4_ = auVar76._12_4_ * fVar246;
      auVar230._0_4_ = auVar85._0_4_ * fVar250;
      auVar230._4_4_ = auVar85._4_4_ * fVar233;
      auVar230._8_4_ = auVar85._8_4_ * fVar245;
      auVar230._12_4_ = auVar85._12_4_ * fVar246;
      auVar237._0_4_ = auVar84._0_4_ * fVar250;
      auVar237._4_4_ = auVar84._4_4_ * fVar233;
      auVar237._8_4_ = auVar84._8_4_ * fVar245;
      auVar237._12_4_ = auVar84._12_4_ * fVar246;
      auVar202._0_4_ = auVar83._0_4_ * fVar250;
      auVar202._4_4_ = auVar83._4_4_ * fVar233;
      auVar202._8_4_ = auVar83._8_4_ * fVar245;
      auVar202._12_4_ = auVar83._12_4_ * fVar246;
      auVar76 = vfmadd231ps_fma(auVar217,auVar259,auVar78);
      auVar85 = vfmadd231ps_fma(auVar230,auVar259,auVar181);
      auVar82 = vfmadd231ps_fma(auVar237,auVar259,auVar72);
      auVar73 = vfmadd231ps_fma(auVar202,(undefined1  [16])0x0,auVar259);
      auVar65 = vshufpd_avx(auVar76,auVar76,1);
      auVar68 = vshufpd_avx(auVar85,auVar85,1);
      auVar69 = vshufpd_avx(auVar82,auVar82,1);
      auVar70 = vshufpd_avx(auVar73,auVar73,1);
      auVar84 = vminss_avx(auVar76,auVar85);
      auVar76 = vmaxss_avx(auVar85,auVar76);
      auVar83 = vminss_avx(auVar82,auVar73);
      auVar85 = vmaxss_avx(auVar73,auVar82);
      auVar83 = vminss_avx(auVar84,auVar83);
      auVar76 = vmaxss_avx(auVar85,auVar76);
      auVar82 = vminss_avx(auVar65,auVar68);
      auVar85 = vmaxss_avx(auVar68,auVar65);
      auVar65 = vminss_avx(auVar69,auVar70);
      auVar84 = vmaxss_avx(auVar70,auVar69);
      auVar82 = vminss_avx(auVar82,auVar65);
      auVar85 = vmaxss_avx(auVar84,auVar85);
      auVar84 = vucomiss_avx512f(auVar83);
      in_ZMM22 = ZEXT1664(auVar84);
      if ((uVar59 < 5) || (auVar85 = vucomiss_avx512f(auVar62), uVar59 < 5)) {
        auVar76 = vucomiss_avx512f(auVar62);
        uVar31 = vcmpps_avx512vl(auVar82,auVar77,1);
        uVar32 = vcmpps_avx512vl(auVar83,auVar77,1);
        if ((4 < uVar59 & ((byte)uVar32 | (byte)uVar31)) != 0) goto LAB_01c2a234;
        uVar31 = vcmpps_avx512vl(auVar62,auVar85,5);
        uVar32 = vcmpps_avx512vl(auVar82,auVar77,5);
        if ((((ushort)uVar32 | (ushort)uVar31) & 1) == 0) goto LAB_01c2a234;
        bVar15 = true;
      }
      else {
LAB_01c2a234:
        auVar283._8_8_ = 0;
        auVar283._0_8_ = uVar3;
        uVar31 = vcmpss_avx512f(auVar83,auVar75,1);
        bVar15 = (bool)((byte)uVar31 & 1);
        iVar128 = auVar288._0_4_;
        fVar250 = (float)((uint)bVar15 * -0x40800000 + (uint)!bVar15 * iVar128);
        uVar31 = vcmpss_avx512f(auVar76,auVar75,1);
        bVar15 = (bool)((byte)uVar31 & 1);
        fVar233 = (float)((uint)bVar15 * -0x40800000 + (uint)!bVar15 * iVar128);
        bVar15 = fVar250 != fVar233;
        iVar289 = auVar290._0_4_;
        auVar114._16_48_ = auVar111._16_48_;
        auVar114._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar113._4_60_ = auVar114._4_60_;
        auVar113._0_4_ = (uint)bVar15 * iVar289 + (uint)!bVar15 * 0x7f800000;
        auVar77 = auVar113._0_16_;
        auVar116._16_48_ = auVar111._16_48_;
        auVar116._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar115._4_60_ = auVar116._4_60_;
        auVar115._0_4_ = (uint)bVar15 * iVar289 + (uint)!bVar15 * -0x800000;
        auVar62 = auVar115._0_16_;
        uVar31 = vcmpss_avx512f(auVar82,auVar75,1);
        bVar15 = (bool)((byte)uVar31 & 1);
        fVar245 = (float)((uint)bVar15 * -0x40800000 + (uint)!bVar15 * iVar128);
        if ((fVar250 != fVar245) || (NAN(fVar250) || NAN(fVar245))) {
          fVar246 = auVar82._0_4_;
          fVar250 = auVar83._0_4_;
          bVar15 = fVar246 == fVar250;
          if ((!bVar15) || (NAN(fVar246) || NAN(fVar250))) {
            auVar35._8_4_ = 0x80000000;
            auVar35._0_8_ = 0x8000000080000000;
            auVar35._12_4_ = 0x80000000;
            auVar84 = vxorps_avx512vl(auVar83,auVar35);
            auVar275._0_4_ = auVar84._0_4_ / (fVar246 - fVar250);
            auVar275._4_12_ = auVar84._4_12_;
            auVar84 = vsubss_avx512f(auVar81,auVar275);
            auVar83 = vfmadd213ss_avx512f(auVar84,auVar75,auVar275);
            auVar84 = auVar83;
          }
          else {
            vucomiss_avx512f(auVar75);
            auVar118._16_48_ = auVar111._16_48_;
            auVar118._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar117._4_60_ = auVar118._4_60_;
            auVar117._0_4_ = (uint)bVar15 * iVar289 + (uint)!bVar15 * 0x7f800000;
            auVar83 = auVar117._0_16_;
            auVar84 = ZEXT416((uint)bVar15 * 0x3f800000 + (uint)!bVar15 * -0x800000);
          }
          auVar77 = vminss_avx(auVar77,auVar83);
          auVar62 = vmaxss_avx(auVar84,auVar62);
        }
        uVar31 = vcmpss_avx512f(auVar85,auVar75,1);
        bVar15 = (bool)((byte)uVar31 & 1);
        fVar250 = (float)((uint)bVar15 * -0x40800000 + (uint)!bVar15 * iVar128);
        if ((fVar233 != fVar250) || (NAN(fVar233) || NAN(fVar250))) {
          fVar246 = auVar85._0_4_;
          fVar233 = auVar76._0_4_;
          bVar15 = fVar246 == fVar233;
          if ((!bVar15) || (NAN(fVar246) || NAN(fVar233))) {
            auVar34._8_4_ = 0x80000000;
            auVar34._0_8_ = 0x8000000080000000;
            auVar34._12_4_ = 0x80000000;
            auVar76 = vxorps_avx512vl(auVar76,auVar34);
            auVar238._0_4_ = auVar76._0_4_ / (fVar246 - fVar233);
            auVar238._4_12_ = auVar76._4_12_;
            auVar76 = vsubss_avx512f(auVar81,auVar238);
            auVar85 = vfmadd213ss_avx512f(auVar76,auVar75,auVar238);
            auVar76 = auVar85;
          }
          else {
            vucomiss_avx512f(auVar75);
            auVar120._16_48_ = auVar111._16_48_;
            auVar120._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar119._4_60_ = auVar120._4_60_;
            auVar119._0_4_ = (uint)bVar15 * iVar289 + (uint)!bVar15 * 0x7f800000;
            auVar85 = auVar119._0_16_;
            auVar76 = ZEXT416((uint)bVar15 * 0x3f800000 + (uint)!bVar15 * -0x800000);
          }
          auVar77 = vminss_avx(auVar77,auVar85);
          auVar62 = vmaxss_avx(auVar76,auVar62);
        }
        bVar15 = fVar245 != fVar250;
        auVar76 = vminss_avx512f(auVar77,auVar81);
        auVar122._16_48_ = auVar111._16_48_;
        auVar122._0_16_ = auVar77;
        auVar121._4_60_ = auVar122._4_60_;
        auVar121._0_4_ = (uint)bVar15 * auVar76._0_4_ + (uint)!bVar15 * auVar77._0_4_;
        auVar77 = vmaxss_avx512f(auVar81,auVar62);
        auVar124._16_48_ = auVar111._16_48_;
        auVar124._0_16_ = auVar62;
        auVar123._4_60_ = auVar124._4_60_;
        auVar123._0_4_ = (uint)bVar15 * auVar77._0_4_ + (uint)!bVar15 * auVar62._0_4_;
        auVar62 = vmaxss_avx512f(auVar75,auVar121._0_16_);
        auVar77 = vminss_avx512f(auVar123._0_16_,auVar81);
        bVar15 = true;
        if (auVar77._0_4_ < auVar62._0_4_) {
          auVar284 = ZEXT1664(auVar283);
          auVar125._16_48_ = auVar111._16_48_;
          auVar111 = auVar125;
        }
        else {
          auVar65 = vmaxss_avx512f(auVar75,ZEXT416((uint)(auVar62._0_4_ + -0.1)));
          auVar68 = vminss_avx512f(ZEXT416((uint)(auVar77._0_4_ + 0.1)),auVar81);
          auVar141._0_8_ = auVar78._0_8_;
          auVar141._8_8_ = auVar141._0_8_;
          auVar231._8_8_ = auVar181._0_8_;
          auVar231._0_8_ = auVar181._0_8_;
          auVar239._8_8_ = auVar72._0_8_;
          auVar239._0_8_ = auVar72._0_8_;
          auVar62 = vshufpd_avx(auVar181,auVar181,3);
          auVar77 = vshufpd_avx(auVar72,auVar72,3);
          auVar76 = vshufps_avx(auVar65,auVar68,0);
          auVar82 = vsubps_avx512vl(auVar146,auVar76);
          fVar250 = auVar76._0_4_;
          auVar271._0_4_ = fVar250 * auVar66._0_4_;
          fVar233 = auVar76._4_4_;
          auVar271._4_4_ = fVar233 * auVar66._4_4_;
          fVar245 = auVar76._8_4_;
          auVar271._8_4_ = fVar245 * auVar66._8_4_;
          fVar246 = auVar76._12_4_;
          auVar271._12_4_ = fVar246 * auVar66._12_4_;
          auVar182._0_4_ = fVar250 * auVar62._0_4_;
          auVar182._4_4_ = fVar233 * auVar62._4_4_;
          auVar182._8_4_ = fVar245 * auVar62._8_4_;
          auVar182._12_4_ = fVar246 * auVar62._12_4_;
          auVar195._0_4_ = fVar250 * auVar77._0_4_;
          auVar195._4_4_ = fVar233 * auVar77._4_4_;
          auVar195._8_4_ = fVar245 * auVar77._8_4_;
          auVar195._12_4_ = fVar246 * auVar77._12_4_;
          auVar158._0_4_ = fVar250 * auVar67._0_4_;
          auVar158._4_4_ = fVar233 * auVar67._4_4_;
          auVar158._8_4_ = fVar245 * auVar67._8_4_;
          auVar158._12_4_ = fVar246 * auVar67._12_4_;
          auVar85 = vfmadd231ps_fma(auVar271,auVar82,auVar141);
          auVar84 = vfmadd231ps_fma(auVar182,auVar82,auVar231);
          auVar83 = vfmadd231ps_fma(auVar195,auVar82,auVar239);
          auVar82 = vfmadd231ps_fma(auVar158,auVar82,ZEXT816(0));
          auVar62 = vsubss_avx512f(auVar81,auVar65);
          auVar77 = vmovshdup_avx512vl(auVar283);
          auVar70 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar77._0_4_ * auVar65._0_4_)),auVar283,
                                        auVar62);
          auVar62 = vsubss_avx512f(auVar81,auVar68);
          auVar72 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar68._0_4_ * auVar77._0_4_)),auVar283,
                                        auVar62);
          auVar65 = vdivss_avx512f(auVar81,auVar80);
          auVar62 = vsubps_avx(auVar84,auVar85);
          auVar76 = vmulps_avx512vl(auVar62,auVar63);
          auVar62 = vsubps_avx(auVar83,auVar84);
          auVar80 = vmulps_avx512vl(auVar62,auVar63);
          auVar62 = vsubps_avx(auVar82,auVar83);
          auVar62 = vmulps_avx512vl(auVar62,auVar63);
          auVar77 = vminps_avx(auVar80,auVar62);
          auVar62 = vmaxps_avx(auVar80,auVar62);
          auVar77 = vminps_avx(auVar76,auVar77);
          auVar62 = vmaxps_avx(auVar76,auVar62);
          auVar76 = vshufpd_avx(auVar77,auVar77,3);
          auVar80 = vshufpd_avx(auVar62,auVar62,3);
          auVar77 = vminps_avx(auVar77,auVar76);
          auVar62 = vmaxps_avx(auVar62,auVar80);
          fVar250 = auVar65._0_4_;
          auVar218._0_4_ = fVar250 * auVar77._0_4_;
          auVar218._4_4_ = fVar250 * auVar77._4_4_;
          auVar218._8_4_ = fVar250 * auVar77._8_4_;
          auVar218._12_4_ = fVar250 * auVar77._12_4_;
          auVar203._0_4_ = fVar250 * auVar62._0_4_;
          auVar203._4_4_ = fVar250 * auVar62._4_4_;
          auVar203._8_4_ = fVar250 * auVar62._8_4_;
          auVar203._12_4_ = fVar250 * auVar62._12_4_;
          auVar65 = vdivss_avx512f(auVar81,ZEXT416((uint)(auVar72._0_4_ - auVar70._0_4_)));
          auVar62 = vshufpd_avx(auVar85,auVar85,3);
          auVar77 = vshufpd_avx(auVar84,auVar84,3);
          auVar76 = vshufpd_avx(auVar83,auVar83,3);
          auVar80 = vshufpd_avx(auVar82,auVar82,3);
          auVar62 = vsubps_avx(auVar62,auVar85);
          auVar85 = vsubps_avx(auVar77,auVar84);
          auVar84 = vsubps_avx(auVar76,auVar83);
          auVar80 = vsubps_avx(auVar80,auVar82);
          auVar77 = vminps_avx(auVar62,auVar85);
          auVar62 = vmaxps_avx(auVar62,auVar85);
          auVar76 = vminps_avx(auVar84,auVar80);
          auVar76 = vminps_avx(auVar77,auVar76);
          auVar77 = vmaxps_avx(auVar84,auVar80);
          auVar62 = vmaxps_avx(auVar62,auVar77);
          fVar250 = auVar65._0_4_;
          auVar240._0_4_ = fVar250 * auVar76._0_4_;
          auVar240._4_4_ = fVar250 * auVar76._4_4_;
          auVar240._8_4_ = fVar250 * auVar76._8_4_;
          auVar240._12_4_ = fVar250 * auVar76._12_4_;
          auVar252._0_4_ = fVar250 * auVar62._0_4_;
          auVar252._4_4_ = fVar250 * auVar62._4_4_;
          auVar252._8_4_ = fVar250 * auVar62._8_4_;
          auVar252._12_4_ = fVar250 * auVar62._12_4_;
          auVar69 = vinsertps_avx512f(auVar125._0_16_,auVar70,0x10);
          auVar85 = vinsertps_avx(auVar79,auVar72,0x10);
          auVar134._0_4_ = auVar69._0_4_ + auVar85._0_4_;
          auVar134._4_4_ = auVar69._4_4_ + auVar85._4_4_;
          auVar134._8_4_ = auVar69._8_4_ + auVar85._8_4_;
          auVar134._12_4_ = auVar69._12_4_ + auVar85._12_4_;
          auVar33._8_4_ = 0x3f000000;
          auVar33._0_8_ = 0x3f0000003f000000;
          auVar33._12_4_ = 0x3f000000;
          auVar67 = vmulps_avx512vl(auVar134,auVar33);
          auVar76 = vshufps_avx(auVar67,auVar67,0x54);
          uVar130 = auVar67._0_4_;
          auVar151._4_4_ = uVar130;
          auVar151._0_4_ = uVar130;
          auVar151._8_4_ = uVar130;
          auVar151._12_4_ = uVar130;
          auVar77 = vfmadd213ps_fma(local_470,auVar151,auVar74);
          auVar80 = vfmadd213ps_fma(local_480,auVar151,auVar64);
          auVar84 = vfmadd213ps_avx512vl(local_490,auVar151,auVar71);
          auVar62 = vsubps_avx(auVar80,auVar77);
          auVar77 = vfmadd213ps_fma(auVar62,auVar151,auVar77);
          auVar62 = vsubps_avx(auVar84,auVar80);
          auVar62 = vfmadd213ps_fma(auVar62,auVar151,auVar80);
          auVar62 = vsubps_avx(auVar62,auVar77);
          auVar77 = vfmadd231ps_fma(auVar77,auVar62,auVar151);
          auVar83 = vmulps_avx512vl(auVar62,auVar63);
          auVar260._8_8_ = auVar77._0_8_;
          auVar260._0_8_ = auVar77._0_8_;
          auVar62 = vshufpd_avx(auVar77,auVar77,3);
          auVar77 = vshufps_avx(auVar67,auVar67,0x55);
          auVar80 = vsubps_avx(auVar62,auVar260);
          auVar84 = vfmadd231ps_fma(auVar260,auVar77,auVar80);
          auVar276._8_8_ = auVar83._0_8_;
          auVar276._0_8_ = auVar83._0_8_;
          auVar62 = vshufpd_avx(auVar83,auVar83,3);
          auVar62 = vsubps_avx(auVar62,auVar276);
          auVar77 = vfmadd213ps_fma(auVar62,auVar77,auVar276);
          auVar152._0_8_ = auVar80._0_8_ ^ 0x8000000080000000;
          auVar152._8_4_ = auVar80._8_4_ ^ 0x80000000;
          auVar152._12_4_ = auVar80._12_4_ ^ 0x80000000;
          auVar62 = vmovshdup_avx(auVar77);
          auVar277._0_8_ = auVar62._0_8_ ^ 0x8000000080000000;
          auVar277._8_4_ = auVar62._8_4_ ^ 0x80000000;
          auVar277._12_4_ = auVar62._12_4_ ^ 0x80000000;
          auVar83 = vmovshdup_avx512vl(auVar80);
          auVar82 = vpermt2ps_avx512vl(auVar277,ZEXT416(5),auVar80);
          auVar62 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar62._0_4_ * auVar80._0_4_)),auVar77,
                                        auVar83);
          auVar77 = vpermt2ps_avx512vl(auVar77,SUB6416(ZEXT464(4),0),auVar152);
          auVar159._0_4_ = auVar62._0_4_;
          auVar159._4_4_ = auVar159._0_4_;
          auVar159._8_4_ = auVar159._0_4_;
          auVar159._12_4_ = auVar159._0_4_;
          auVar62 = vdivps_avx(auVar82,auVar159);
          auVar77 = vdivps_avx(auVar77,auVar159);
          fVar233 = auVar84._0_4_;
          auVar80 = vshufps_avx(auVar84,auVar84,0x55);
          fVar250 = auVar77._0_4_;
          auVar261._0_4_ = fVar233 * auVar62._0_4_ + auVar80._0_4_ * fVar250;
          auVar261._4_4_ = fVar233 * auVar62._4_4_ + auVar80._4_4_ * auVar77._4_4_;
          auVar261._8_4_ = fVar233 * auVar62._8_4_ + auVar80._8_4_ * auVar77._8_4_;
          auVar261._12_4_ = fVar233 * auVar62._12_4_ + auVar80._12_4_ * auVar77._12_4_;
          auVar68 = vsubps_avx(auVar76,auVar261);
          auVar84 = vmovshdup_avx(auVar62);
          auVar76 = vinsertps_avx(auVar218,auVar240,0x1c);
          auVar278._0_4_ = auVar84._0_4_ * auVar76._0_4_;
          auVar278._4_4_ = auVar84._4_4_ * auVar76._4_4_;
          auVar278._8_4_ = auVar84._8_4_ * auVar76._8_4_;
          auVar278._12_4_ = auVar84._12_4_ * auVar76._12_4_;
          auVar80 = vinsertps_avx(auVar203,auVar252,0x1c);
          auVar262._0_4_ = auVar84._0_4_ * auVar80._0_4_;
          auVar262._4_4_ = auVar84._4_4_ * auVar80._4_4_;
          auVar262._8_4_ = auVar84._8_4_ * auVar80._8_4_;
          auVar262._12_4_ = auVar84._12_4_ * auVar80._12_4_;
          auVar66 = vminps_avx512vl(auVar278,auVar262);
          auVar82 = vmaxps_avx(auVar262,auVar278);
          auVar65 = vmovshdup_avx(auVar77);
          auVar84 = vinsertps_avx(auVar240,auVar218,0x4c);
          auVar241._0_4_ = auVar65._0_4_ * auVar84._0_4_;
          auVar241._4_4_ = auVar65._4_4_ * auVar84._4_4_;
          auVar241._8_4_ = auVar65._8_4_ * auVar84._8_4_;
          auVar241._12_4_ = auVar65._12_4_ * auVar84._12_4_;
          auVar83 = vinsertps_avx(auVar252,auVar203,0x4c);
          auVar253._0_4_ = auVar65._0_4_ * auVar83._0_4_;
          auVar253._4_4_ = auVar65._4_4_ * auVar83._4_4_;
          auVar253._8_4_ = auVar65._8_4_ * auVar83._8_4_;
          auVar253._12_4_ = auVar65._12_4_ * auVar83._12_4_;
          auVar65 = vminps_avx(auVar241,auVar253);
          auVar66 = vaddps_avx512vl(auVar66,auVar65);
          auVar65 = vmaxps_avx(auVar253,auVar241);
          auVar242._0_4_ = auVar82._0_4_ + auVar65._0_4_;
          auVar242._4_4_ = auVar82._4_4_ + auVar65._4_4_;
          auVar242._8_4_ = auVar82._8_4_ + auVar65._8_4_;
          auVar242._12_4_ = auVar82._12_4_ + auVar65._12_4_;
          auVar254._8_8_ = 0x3f80000000000000;
          auVar254._0_8_ = 0x3f80000000000000;
          auVar82 = vsubps_avx(auVar254,auVar242);
          auVar65 = vsubps_avx(auVar254,auVar66);
          auVar66 = vsubps_avx(auVar69,auVar67);
          auVar67 = vsubps_avx(auVar85,auVar67);
          fVar248 = auVar66._0_4_;
          auVar279._0_4_ = fVar248 * auVar82._0_4_;
          fVar249 = auVar66._4_4_;
          auVar279._4_4_ = fVar249 * auVar82._4_4_;
          fVar266 = auVar66._8_4_;
          auVar279._8_4_ = fVar266 * auVar82._8_4_;
          fVar209 = auVar66._12_4_;
          auVar279._12_4_ = fVar209 * auVar82._12_4_;
          auVar73 = vbroadcastss_avx512vl(auVar62);
          auVar76 = vmulps_avx512vl(auVar73,auVar76);
          auVar80 = vmulps_avx512vl(auVar73,auVar80);
          auVar73 = vminps_avx512vl(auVar76,auVar80);
          auVar76 = vmaxps_avx(auVar80,auVar76);
          auVar219._0_4_ = fVar250 * auVar84._0_4_;
          auVar219._4_4_ = fVar250 * auVar84._4_4_;
          auVar219._8_4_ = fVar250 * auVar84._8_4_;
          auVar219._12_4_ = fVar250 * auVar84._12_4_;
          auVar204._0_4_ = fVar250 * auVar83._0_4_;
          auVar204._4_4_ = fVar250 * auVar83._4_4_;
          auVar204._8_4_ = fVar250 * auVar83._8_4_;
          auVar204._12_4_ = fVar250 * auVar83._12_4_;
          auVar80 = vminps_avx(auVar219,auVar204);
          auVar84 = vaddps_avx512vl(auVar73,auVar80);
          auVar83 = vmulps_avx512vl(auVar66,auVar65);
          fVar233 = auVar67._0_4_;
          auVar243._0_4_ = fVar233 * auVar82._0_4_;
          fVar245 = auVar67._4_4_;
          auVar243._4_4_ = fVar245 * auVar82._4_4_;
          fVar246 = auVar67._8_4_;
          auVar243._8_4_ = fVar246 * auVar82._8_4_;
          fVar247 = auVar67._12_4_;
          auVar243._12_4_ = fVar247 * auVar82._12_4_;
          auVar255._0_4_ = fVar233 * auVar65._0_4_;
          auVar255._4_4_ = fVar245 * auVar65._4_4_;
          auVar255._8_4_ = fVar246 * auVar65._8_4_;
          auVar255._12_4_ = fVar247 * auVar65._12_4_;
          auVar80 = vmaxps_avx(auVar204,auVar219);
          auVar205._0_4_ = auVar76._0_4_ + auVar80._0_4_;
          auVar205._4_4_ = auVar76._4_4_ + auVar80._4_4_;
          auVar205._8_4_ = auVar76._8_4_ + auVar80._8_4_;
          auVar205._12_4_ = auVar76._12_4_ + auVar80._12_4_;
          auVar220._8_8_ = 0x3f800000;
          auVar220._0_8_ = 0x3f800000;
          auVar76 = vsubps_avx(auVar220,auVar205);
          auVar80 = vsubps_avx(auVar220,auVar84);
          auVar272._0_4_ = fVar248 * auVar76._0_4_;
          auVar272._4_4_ = fVar249 * auVar76._4_4_;
          auVar272._8_4_ = fVar266 * auVar76._8_4_;
          auVar272._12_4_ = fVar209 * auVar76._12_4_;
          auVar263._0_4_ = fVar248 * auVar80._0_4_;
          auVar263._4_4_ = fVar249 * auVar80._4_4_;
          auVar263._8_4_ = fVar266 * auVar80._8_4_;
          auVar263._12_4_ = fVar209 * auVar80._12_4_;
          auVar206._0_4_ = fVar233 * auVar76._0_4_;
          auVar206._4_4_ = fVar245 * auVar76._4_4_;
          auVar206._8_4_ = fVar246 * auVar76._8_4_;
          auVar206._12_4_ = fVar247 * auVar76._12_4_;
          auVar221._0_4_ = fVar233 * auVar80._0_4_;
          auVar221._4_4_ = fVar245 * auVar80._4_4_;
          auVar221._8_4_ = fVar246 * auVar80._8_4_;
          auVar221._12_4_ = fVar247 * auVar80._12_4_;
          auVar76 = vminps_avx(auVar272,auVar263);
          auVar80 = vminps_avx(auVar206,auVar221);
          auVar84 = vminps_avx(auVar76,auVar80);
          auVar76 = vmaxps_avx(auVar263,auVar272);
          auVar80 = vmaxps_avx(auVar221,auVar206);
          auVar80 = vmaxps_avx(auVar80,auVar76);
          auVar82 = vminps_avx512vl(auVar279,auVar83);
          auVar76 = vminps_avx(auVar243,auVar255);
          auVar76 = vminps_avx(auVar82,auVar76);
          auVar76 = vhaddps_avx(auVar84,auVar76);
          auVar83 = vmaxps_avx512vl(auVar83,auVar279);
          auVar84 = vmaxps_avx(auVar255,auVar243);
          auVar84 = vmaxps_avx(auVar84,auVar83);
          auVar80 = vhaddps_avx(auVar80,auVar84);
          auVar76 = vshufps_avx(auVar76,auVar76,0xe8);
          auVar80 = vshufps_avx(auVar80,auVar80,0xe8);
          auVar207._0_4_ = auVar76._0_4_ + auVar68._0_4_;
          auVar207._4_4_ = auVar76._4_4_ + auVar68._4_4_;
          auVar207._8_4_ = auVar76._8_4_ + auVar68._8_4_;
          auVar207._12_4_ = auVar76._12_4_ + auVar68._12_4_;
          auVar222._0_4_ = auVar80._0_4_ + auVar68._0_4_;
          auVar222._4_4_ = auVar80._4_4_ + auVar68._4_4_;
          auVar222._8_4_ = auVar80._8_4_ + auVar68._8_4_;
          auVar222._12_4_ = auVar80._12_4_ + auVar68._12_4_;
          auVar76 = vmaxps_avx(auVar69,auVar207);
          auVar80 = vminps_avx(auVar222,auVar85);
          uVar3 = vcmpps_avx512vl(auVar80,auVar76,1);
          auVar76 = vinsertps_avx512f(auVar70,auVar72,0x10);
          auVar284 = ZEXT1664(auVar76);
          if ((uVar3 & 3) == 0) {
            vucomiss_avx512f(auVar125._0_16_);
            auVar287 = ZEXT1664(auVar146);
            auVar111._0_16_ = auVar74;
            if (uVar59 < 4 && (uVar8 == 0 || lVar56 == 0)) {
              bVar15 = false;
            }
            else {
              lVar56 = 200;
              do {
                auVar80 = vsubss_avx512f(auVar81,auVar68);
                fVar246 = auVar80._0_4_;
                fVar233 = fVar246 * fVar246 * fVar246;
                fVar247 = auVar68._0_4_;
                fVar245 = fVar247 * 3.0 * fVar246 * fVar246;
                fVar246 = fVar246 * fVar247 * fVar247 * 3.0;
                auVar183._4_4_ = fVar233;
                auVar183._0_4_ = fVar233;
                auVar183._8_4_ = fVar233;
                auVar183._12_4_ = fVar233;
                auVar169._4_4_ = fVar245;
                auVar169._0_4_ = fVar245;
                auVar169._8_4_ = fVar245;
                auVar169._12_4_ = fVar245;
                auVar142._4_4_ = fVar246;
                auVar142._0_4_ = fVar246;
                auVar142._8_4_ = fVar246;
                auVar142._12_4_ = fVar246;
                fVar247 = fVar247 * fVar247 * fVar247;
                auVar196._0_4_ = (float)local_680._0_4_ * fVar247;
                auVar196._4_4_ = (float)local_680._4_4_ * fVar247;
                auVar196._8_4_ = fStack_678 * fVar247;
                auVar196._12_4_ = fStack_674 * fVar247;
                auVar80 = vfmadd231ps_fma(auVar196,auVar71,auVar142);
                auVar80 = vfmadd231ps_fma(auVar80,auVar64,auVar169);
                auVar80 = vfmadd231ps_avx512vl(auVar80,auVar74,auVar183);
                auVar143._8_8_ = auVar80._0_8_;
                auVar143._0_8_ = auVar80._0_8_;
                auVar80 = vshufpd_avx(auVar80,auVar80,3);
                auVar85 = vshufps_avx(auVar68,auVar68,0x55);
                auVar80 = vsubps_avx(auVar80,auVar143);
                auVar85 = vfmadd213ps_fma(auVar80,auVar85,auVar143);
                fVar233 = auVar85._0_4_;
                auVar80 = vshufps_avx(auVar85,auVar85,0x55);
                auVar144._0_4_ = auVar62._0_4_ * fVar233 + fVar250 * auVar80._0_4_;
                auVar144._4_4_ = auVar62._4_4_ * fVar233 + auVar77._4_4_ * auVar80._4_4_;
                auVar144._8_4_ = auVar62._8_4_ * fVar233 + auVar77._8_4_ * auVar80._8_4_;
                auVar144._12_4_ = auVar62._12_4_ * fVar233 + auVar77._12_4_ * auVar80._12_4_;
                auVar68 = vsubps_avx(auVar68,auVar144);
                auVar80 = vandps_avx512vl(auVar85,auVar286._0_16_);
                auVar111._0_16_ = vprolq_avx512vl(auVar80,0x20);
                auVar80 = vmaxss_avx(auVar111._0_16_,auVar80);
                bVar30 = auVar80._0_4_ <= (float)local_690._0_4_;
                if (auVar80._0_4_ < (float)local_690._0_4_) {
                  auVar62 = vucomiss_avx512f(auVar75);
                  if (bVar30) {
                    auVar77 = vucomiss_avx512f(auVar62);
                    auVar288 = ZEXT1664(auVar77);
                    if (bVar30) {
                      vmovshdup_avx(auVar62);
                      auVar77 = vucomiss_avx512f(auVar75);
                      if (bVar30) {
                        auVar80 = vucomiss_avx512f(auVar77);
                        auVar288 = ZEXT1664(auVar80);
                        if (bVar30) {
                          auVar81 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]
                                                         ),ZEXT416((uint)pre->ray_space[k].vy.
                                                                         field_0.m128[2]),0x1c);
                          auVar67 = vinsertps_avx(auVar81,ZEXT416((uint)pre->ray_space[k].vz.field_0
                                                                        .m128[2]),0x28);
                          auVar81 = vdpps_avx(auVar67,local_4a0,0x7f);
                          auVar85 = vdpps_avx(auVar67,local_4b0,0x7f);
                          auVar84 = vdpps_avx(auVar67,local_4c0,0x7f);
                          auVar83 = vdpps_avx(auVar67,local_4d0,0x7f);
                          auVar82 = vdpps_avx(auVar67,local_4e0,0x7f);
                          auVar65 = vdpps_avx(auVar67,local_4f0,0x7f);
                          auVar66 = vdpps_avx(auVar67,local_500,0x7f);
                          auVar67 = vdpps_avx(auVar67,local_510,0x7f);
                          auVar68 = vsubss_avx512f(auVar80,auVar77);
                          fVar247 = auVar77._0_4_;
                          auVar77 = vfmadd231ss_fma(ZEXT416((uint)(fVar247 * auVar82._0_4_)),auVar68
                                                    ,auVar81);
                          auVar81 = vfmadd231ss_fma(ZEXT416((uint)(auVar65._0_4_ * fVar247)),auVar68
                                                    ,auVar85);
                          auVar85 = vfmadd231ss_fma(ZEXT416((uint)(auVar66._0_4_ * fVar247)),auVar68
                                                    ,auVar84);
                          auVar84 = vfmadd231ss_fma(ZEXT416((uint)(fVar247 * auVar67._0_4_)),auVar68
                                                    ,auVar83);
                          auVar111._0_16_ = vsubss_avx512f(auVar80,auVar62);
                          auVar208._0_4_ = auVar111._0_4_;
                          fVar250 = auVar208._0_4_ * auVar208._0_4_ * auVar208._0_4_;
                          fVar246 = auVar62._0_4_;
                          fVar233 = fVar246 * 3.0 * auVar208._0_4_ * auVar208._0_4_;
                          fVar245 = auVar208._0_4_ * fVar246 * fVar246 * 3.0;
                          fVar249 = fVar246 * fVar246 * fVar246;
                          auVar80 = vfmadd231ss_fma(ZEXT416((uint)(fVar249 * auVar84._0_4_)),
                                                    ZEXT416((uint)fVar245),auVar85);
                          auVar80 = vfmadd231ss_fma(auVar80,ZEXT416((uint)fVar233),auVar81);
                          auVar77 = vfmadd231ss_fma(auVar80,ZEXT416((uint)fVar250),auVar77);
                          fVar248 = auVar77._0_4_;
                          if ((fVar129 <= fVar248) &&
                             (fVar266 = *(float *)(ray + k * 4 + 0x200), fVar248 <= fVar266)) {
                            auVar77 = vshufps_avx(auVar62,auVar62,0x55);
                            auVar85 = vsubps_avx512vl(auVar146,auVar77);
                            fVar209 = auVar77._0_4_;
                            auVar244._0_4_ = fVar209 * (float)local_560._0_4_;
                            fVar226 = auVar77._4_4_;
                            auVar244._4_4_ = fVar226 * (float)local_560._4_4_;
                            fVar227 = auVar77._8_4_;
                            auVar244._8_4_ = fVar227 * fStack_558;
                            fVar228 = auVar77._12_4_;
                            auVar244._12_4_ = fVar228 * fStack_554;
                            auVar256._0_4_ = fVar209 * (float)local_570._0_4_;
                            auVar256._4_4_ = fVar226 * (float)local_570._4_4_;
                            auVar256._8_4_ = fVar227 * fStack_568;
                            auVar256._12_4_ = fVar228 * fStack_564;
                            auVar264._0_4_ = fVar209 * (float)local_580._0_4_;
                            auVar264._4_4_ = fVar226 * (float)local_580._4_4_;
                            auVar264._8_4_ = fVar227 * fStack_578;
                            auVar264._12_4_ = fVar228 * fStack_574;
                            auVar223._0_4_ = fVar209 * (float)local_590._0_4_;
                            auVar223._4_4_ = fVar226 * (float)local_590._4_4_;
                            auVar223._8_4_ = fVar227 * fStack_588;
                            auVar223._12_4_ = fVar228 * fStack_584;
                            auVar77 = vfmadd231ps_fma(auVar244,auVar85,local_520);
                            auVar80 = vfmadd231ps_fma(auVar256,auVar85,local_530);
                            auVar81 = vfmadd231ps_fma(auVar264,auVar85,local_540);
                            auVar85 = vfmadd231ps_fma(auVar223,auVar85,local_550);
                            auVar77 = vsubps_avx(auVar80,auVar77);
                            auVar80 = vsubps_avx(auVar81,auVar80);
                            auVar81 = vsubps_avx(auVar85,auVar81);
                            auVar265._0_4_ = fVar246 * auVar80._0_4_;
                            auVar265._4_4_ = fVar246 * auVar80._4_4_;
                            auVar265._8_4_ = fVar246 * auVar80._8_4_;
                            auVar265._12_4_ = fVar246 * auVar80._12_4_;
                            auVar208._4_4_ = auVar208._0_4_;
                            auVar208._8_4_ = auVar208._0_4_;
                            auVar208._12_4_ = auVar208._0_4_;
                            auVar77 = vfmadd231ps_fma(auVar265,auVar208,auVar77);
                            auVar224._0_4_ = fVar246 * auVar81._0_4_;
                            auVar224._4_4_ = fVar246 * auVar81._4_4_;
                            auVar224._8_4_ = fVar246 * auVar81._8_4_;
                            auVar224._12_4_ = fVar246 * auVar81._12_4_;
                            auVar80 = vfmadd231ps_fma(auVar224,auVar208,auVar80);
                            auVar225._0_4_ = fVar246 * auVar80._0_4_;
                            auVar225._4_4_ = fVar246 * auVar80._4_4_;
                            auVar225._8_4_ = fVar246 * auVar80._8_4_;
                            auVar225._12_4_ = fVar246 * auVar80._12_4_;
                            auVar77 = vfmadd231ps_fma(auVar225,auVar208,auVar77);
                            auVar111._0_16_ = vmulps_avx512vl(auVar77,auVar63);
                            pGVar9 = (context->scene->geometries).items[uVar60].ptr;
                            if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                              auVar197._0_4_ = fVar249 * (float)local_5d0._0_4_;
                              auVar197._4_4_ = fVar249 * (float)local_5d0._4_4_;
                              auVar197._8_4_ = fVar249 * fStack_5c8;
                              auVar197._12_4_ = fVar249 * fStack_5c4;
                              auVar184._4_4_ = fVar245;
                              auVar184._0_4_ = fVar245;
                              auVar184._8_4_ = fVar245;
                              auVar184._12_4_ = fVar245;
                              auVar63 = vfmadd132ps_fma(auVar184,auVar197,local_5c0);
                              auVar170._4_4_ = fVar233;
                              auVar170._0_4_ = fVar233;
                              auVar170._8_4_ = fVar233;
                              auVar170._12_4_ = fVar233;
                              auVar63 = vfmadd132ps_fma(auVar170,auVar63,local_5b0);
                              auVar160._4_4_ = fVar250;
                              auVar160._0_4_ = fVar250;
                              auVar160._8_4_ = fVar250;
                              auVar160._12_4_ = fVar250;
                              auVar80 = vfmadd132ps_fma(auVar160,auVar63,local_5a0);
                              auVar63 = vshufps_avx(auVar80,auVar80,0xc9);
                              auVar77 = vshufps_avx(auVar111._0_16_,auVar111._0_16_,0xc9);
                              auVar161._0_4_ = auVar80._0_4_ * auVar77._0_4_;
                              auVar161._4_4_ = auVar80._4_4_ * auVar77._4_4_;
                              auVar161._8_4_ = auVar80._8_4_ * auVar77._8_4_;
                              auVar161._12_4_ = auVar80._12_4_ * auVar77._12_4_;
                              auVar63 = vfmsub231ps_fma(auVar161,auVar111._0_16_,auVar63);
                              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                                 (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                                *(float *)(ray + k * 4 + 0x200) = fVar248;
                                uVar130 = vextractps_avx(auVar63,1);
                                *(undefined4 *)(ray + k * 4 + 0x300) = uVar130;
                                uVar130 = vextractps_avx(auVar63,2);
                                *(undefined4 *)(ray + k * 4 + 0x340) = uVar130;
                                *(int *)(ray + k * 4 + 0x380) = auVar63._0_4_;
                                *(float *)(ray + k * 4 + 0x3c0) = fVar246;
                                *(float *)(ray + k * 4 + 0x400) = fVar247;
                                *(uint *)(ray + k * 4 + 0x440) = uVar7;
                                *(uint *)(ray + k * 4 + 0x480) = uVar60;
                                *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                                *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                              }
                              else {
                                local_200 = vbroadcastss_avx512f(auVar62);
                                auVar111 = vbroadcastss_avx512f(ZEXT416(1));
                                local_1c0 = vpermps_avx512f(auVar111,ZEXT1664(auVar62));
                                auVar111 = vpermps_avx512f(auVar111,ZEXT1664(auVar63));
                                auVar287 = vbroadcastss_avx512f(ZEXT416(2));
                                local_280 = vpermps_avx512f(auVar287,ZEXT1664(auVar63));
                                local_240 = vbroadcastss_avx512f(auVar63);
                                local_2c0[0] = (RTCHitN)auVar111[0];
                                local_2c0[1] = (RTCHitN)auVar111[1];
                                local_2c0[2] = (RTCHitN)auVar111[2];
                                local_2c0[3] = (RTCHitN)auVar111[3];
                                local_2c0[4] = (RTCHitN)auVar111[4];
                                local_2c0[5] = (RTCHitN)auVar111[5];
                                local_2c0[6] = (RTCHitN)auVar111[6];
                                local_2c0[7] = (RTCHitN)auVar111[7];
                                local_2c0[8] = (RTCHitN)auVar111[8];
                                local_2c0[9] = (RTCHitN)auVar111[9];
                                local_2c0[10] = (RTCHitN)auVar111[10];
                                local_2c0[0xb] = (RTCHitN)auVar111[0xb];
                                local_2c0[0xc] = (RTCHitN)auVar111[0xc];
                                local_2c0[0xd] = (RTCHitN)auVar111[0xd];
                                local_2c0[0xe] = (RTCHitN)auVar111[0xe];
                                local_2c0[0xf] = (RTCHitN)auVar111[0xf];
                                local_2c0[0x10] = (RTCHitN)auVar111[0x10];
                                local_2c0[0x11] = (RTCHitN)auVar111[0x11];
                                local_2c0[0x12] = (RTCHitN)auVar111[0x12];
                                local_2c0[0x13] = (RTCHitN)auVar111[0x13];
                                local_2c0[0x14] = (RTCHitN)auVar111[0x14];
                                local_2c0[0x15] = (RTCHitN)auVar111[0x15];
                                local_2c0[0x16] = (RTCHitN)auVar111[0x16];
                                local_2c0[0x17] = (RTCHitN)auVar111[0x17];
                                local_2c0[0x18] = (RTCHitN)auVar111[0x18];
                                local_2c0[0x19] = (RTCHitN)auVar111[0x19];
                                local_2c0[0x1a] = (RTCHitN)auVar111[0x1a];
                                local_2c0[0x1b] = (RTCHitN)auVar111[0x1b];
                                local_2c0[0x1c] = (RTCHitN)auVar111[0x1c];
                                local_2c0[0x1d] = (RTCHitN)auVar111[0x1d];
                                local_2c0[0x1e] = (RTCHitN)auVar111[0x1e];
                                local_2c0[0x1f] = (RTCHitN)auVar111[0x1f];
                                local_2c0[0x20] = (RTCHitN)auVar111[0x20];
                                local_2c0[0x21] = (RTCHitN)auVar111[0x21];
                                local_2c0[0x22] = (RTCHitN)auVar111[0x22];
                                local_2c0[0x23] = (RTCHitN)auVar111[0x23];
                                local_2c0[0x24] = (RTCHitN)auVar111[0x24];
                                local_2c0[0x25] = (RTCHitN)auVar111[0x25];
                                local_2c0[0x26] = (RTCHitN)auVar111[0x26];
                                local_2c0[0x27] = (RTCHitN)auVar111[0x27];
                                local_2c0[0x28] = (RTCHitN)auVar111[0x28];
                                local_2c0[0x29] = (RTCHitN)auVar111[0x29];
                                local_2c0[0x2a] = (RTCHitN)auVar111[0x2a];
                                local_2c0[0x2b] = (RTCHitN)auVar111[0x2b];
                                local_2c0[0x2c] = (RTCHitN)auVar111[0x2c];
                                local_2c0[0x2d] = (RTCHitN)auVar111[0x2d];
                                local_2c0[0x2e] = (RTCHitN)auVar111[0x2e];
                                local_2c0[0x2f] = (RTCHitN)auVar111[0x2f];
                                local_2c0[0x30] = (RTCHitN)auVar111[0x30];
                                local_2c0[0x31] = (RTCHitN)auVar111[0x31];
                                local_2c0[0x32] = (RTCHitN)auVar111[0x32];
                                local_2c0[0x33] = (RTCHitN)auVar111[0x33];
                                local_2c0[0x34] = (RTCHitN)auVar111[0x34];
                                local_2c0[0x35] = (RTCHitN)auVar111[0x35];
                                local_2c0[0x36] = (RTCHitN)auVar111[0x36];
                                local_2c0[0x37] = (RTCHitN)auVar111[0x37];
                                local_2c0[0x38] = (RTCHitN)auVar111[0x38];
                                local_2c0[0x39] = (RTCHitN)auVar111[0x39];
                                local_2c0[0x3a] = (RTCHitN)auVar111[0x3a];
                                local_2c0[0x3b] = (RTCHitN)auVar111[0x3b];
                                local_2c0[0x3c] = (RTCHitN)auVar111[0x3c];
                                local_2c0[0x3d] = (RTCHitN)auVar111[0x3d];
                                local_2c0[0x3e] = (RTCHitN)auVar111[0x3e];
                                local_2c0[0x3f] = (RTCHitN)auVar111[0x3f];
                                local_180 = local_340._0_8_;
                                uStack_178 = local_340._8_8_;
                                uStack_170 = local_340._16_8_;
                                uStack_168 = local_340._24_8_;
                                uStack_160 = local_340._32_8_;
                                uStack_158 = local_340._40_8_;
                                uStack_150 = local_340._48_8_;
                                uStack_148 = local_340._56_8_;
                                auVar111 = vmovdqa64_avx512f(local_300);
                                local_140 = vmovdqa64_avx512f(auVar111);
                                vpcmpeqd_avx2(auVar111._0_32_,auVar111._0_32_);
                                local_100 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                                local_c0 = vbroadcastss_avx512f
                                                     (ZEXT416(context->user->instPrimID[0]));
                                *(float *)(ray + k * 4 + 0x200) = fVar248;
                                local_440 = local_380;
                                local_6c0.valid = (int *)local_440;
                                local_6c0.geometryUserPtr = pGVar9->userPtr;
                                local_6c0.context = context->user;
                                local_6c0.hit = local_2c0;
                                local_6c0.N = 0x10;
                                local_6c0.ray = (RTCRayN *)ray;
                                if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                                  (*pGVar9->intersectionFilterN)(&local_6c0);
                                  in_ZMM22 = ZEXT464(0x38d1b717);
                                  in_ZMM19 = ZEXT464(0x3e2aaaab);
                                  auVar112._32_32_ = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                  auVar285 = ZEXT3264(auVar112._32_32_);
                                  auVar288 = ZEXT464(0x3f800000);
                                  auVar62 = vxorps_avx512vl(auVar75,auVar75);
                                  auVar290 = ZEXT1664(auVar62);
                                  auVar62 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                  auVar286 = ZEXT1664(auVar62);
                                }
                                auVar62 = auVar290._0_16_;
                                auVar111 = vmovdqa64_avx512f(local_440);
                                auVar127 = auVar111._16_48_;
                                uVar31 = vptestmd_avx512f(auVar111,auVar111);
                                if ((short)uVar31 == 0) {
LAB_01c2afc8:
                                  *(float *)(ray + k * 4 + 0x200) = fVar266;
                                }
                                else {
                                  p_Var14 = context->args->filter;
                                  if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                                     (((context->args->flags &
                                       RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                      (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                                    (*p_Var14)(&local_6c0);
                                    in_ZMM22 = ZEXT464(0x38d1b717);
                                    in_ZMM19 = ZEXT464(0x3e2aaaab);
                                    auVar112._32_32_ = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                    auVar285 = ZEXT3264(auVar112._32_32_);
                                    auVar288 = ZEXT464(0x3f800000);
                                    auVar62 = vxorps_avx512vl(auVar62,auVar62);
                                    auVar290 = ZEXT1664(auVar62);
                                    auVar62 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                    auVar286 = ZEXT1664(auVar62);
                                  }
                                  auVar111 = vmovdqa64_avx512f(local_440);
                                  auVar127 = auVar111._16_48_;
                                  uVar3 = vptestmd_avx512f(auVar111,auVar111);
                                  if ((short)uVar3 == 0) goto LAB_01c2afc8;
                                  iVar128 = *(int *)(local_6c0.hit + 4);
                                  iVar289 = *(int *)(local_6c0.hit + 8);
                                  iVar38 = *(int *)(local_6c0.hit + 0xc);
                                  iVar39 = *(int *)(local_6c0.hit + 0x10);
                                  iVar40 = *(int *)(local_6c0.hit + 0x14);
                                  iVar41 = *(int *)(local_6c0.hit + 0x18);
                                  iVar42 = *(int *)(local_6c0.hit + 0x1c);
                                  iVar43 = *(int *)(local_6c0.hit + 0x20);
                                  iVar44 = *(int *)(local_6c0.hit + 0x24);
                                  iVar45 = *(int *)(local_6c0.hit + 0x28);
                                  iVar46 = *(int *)(local_6c0.hit + 0x2c);
                                  iVar47 = *(int *)(local_6c0.hit + 0x30);
                                  iVar48 = *(int *)(local_6c0.hit + 0x34);
                                  iVar49 = *(int *)(local_6c0.hit + 0x38);
                                  iVar50 = *(int *)(local_6c0.hit + 0x3c);
                                  bVar51 = (byte)uVar3;
                                  bVar30 = (bool)((byte)(uVar3 >> 1) & 1);
                                  bVar16 = (bool)((byte)(uVar3 >> 2) & 1);
                                  bVar17 = (bool)((byte)(uVar3 >> 3) & 1);
                                  bVar18 = (bool)((byte)(uVar3 >> 4) & 1);
                                  bVar19 = (bool)((byte)(uVar3 >> 5) & 1);
                                  bVar20 = (bool)((byte)(uVar3 >> 6) & 1);
                                  bVar21 = (bool)((byte)(uVar3 >> 7) & 1);
                                  bVar22 = (byte)(uVar3 >> 8);
                                  bVar23 = (bool)((byte)(uVar3 >> 9) & 1);
                                  bVar24 = (bool)((byte)(uVar3 >> 10) & 1);
                                  bVar25 = (bool)((byte)(uVar3 >> 0xb) & 1);
                                  bVar26 = (bool)((byte)(uVar3 >> 0xc) & 1);
                                  bVar27 = (bool)((byte)(uVar3 >> 0xd) & 1);
                                  bVar28 = (bool)((byte)(uVar3 >> 0xe) & 1);
                                  bVar29 = SUB81(uVar3 >> 0xf,0);
                                  *(uint *)(local_6c0.ray + 0x300) =
                                       (uint)(bVar51 & 1) * *(int *)local_6c0.hit |
                                       (uint)!(bool)(bVar51 & 1) * *(int *)(local_6c0.ray + 0x300);
                                  *(uint *)(local_6c0.ray + 0x304) =
                                       (uint)bVar30 * iVar128 |
                                       (uint)!bVar30 * *(int *)(local_6c0.ray + 0x304);
                                  *(uint *)(local_6c0.ray + 0x308) =
                                       (uint)bVar16 * iVar289 |
                                       (uint)!bVar16 * *(int *)(local_6c0.ray + 0x308);
                                  *(uint *)(local_6c0.ray + 0x30c) =
                                       (uint)bVar17 * iVar38 |
                                       (uint)!bVar17 * *(int *)(local_6c0.ray + 0x30c);
                                  *(uint *)(local_6c0.ray + 0x310) =
                                       (uint)bVar18 * iVar39 |
                                       (uint)!bVar18 * *(int *)(local_6c0.ray + 0x310);
                                  *(uint *)(local_6c0.ray + 0x314) =
                                       (uint)bVar19 * iVar40 |
                                       (uint)!bVar19 * *(int *)(local_6c0.ray + 0x314);
                                  *(uint *)(local_6c0.ray + 0x318) =
                                       (uint)bVar20 * iVar41 |
                                       (uint)!bVar20 * *(int *)(local_6c0.ray + 0x318);
                                  *(uint *)(local_6c0.ray + 0x31c) =
                                       (uint)bVar21 * iVar42 |
                                       (uint)!bVar21 * *(int *)(local_6c0.ray + 0x31c);
                                  *(uint *)(local_6c0.ray + 800) =
                                       (uint)(bVar22 & 1) * iVar43 |
                                       (uint)!(bool)(bVar22 & 1) * *(int *)(local_6c0.ray + 800);
                                  *(uint *)(local_6c0.ray + 0x324) =
                                       (uint)bVar23 * iVar44 |
                                       (uint)!bVar23 * *(int *)(local_6c0.ray + 0x324);
                                  *(uint *)(local_6c0.ray + 0x328) =
                                       (uint)bVar24 * iVar45 |
                                       (uint)!bVar24 * *(int *)(local_6c0.ray + 0x328);
                                  *(uint *)(local_6c0.ray + 0x32c) =
                                       (uint)bVar25 * iVar46 |
                                       (uint)!bVar25 * *(int *)(local_6c0.ray + 0x32c);
                                  *(uint *)(local_6c0.ray + 0x330) =
                                       (uint)bVar26 * iVar47 |
                                       (uint)!bVar26 * *(int *)(local_6c0.ray + 0x330);
                                  *(uint *)(local_6c0.ray + 0x334) =
                                       (uint)bVar27 * iVar48 |
                                       (uint)!bVar27 * *(int *)(local_6c0.ray + 0x334);
                                  *(uint *)(local_6c0.ray + 0x338) =
                                       (uint)bVar28 * iVar49 |
                                       (uint)!bVar28 * *(int *)(local_6c0.ray + 0x338);
                                  *(uint *)(local_6c0.ray + 0x33c) =
                                       (uint)bVar29 * iVar50 |
                                       (uint)!bVar29 * *(int *)(local_6c0.ray + 0x33c);
                                  iVar128 = *(int *)(local_6c0.hit + 0x44);
                                  iVar289 = *(int *)(local_6c0.hit + 0x48);
                                  iVar38 = *(int *)(local_6c0.hit + 0x4c);
                                  iVar39 = *(int *)(local_6c0.hit + 0x50);
                                  iVar40 = *(int *)(local_6c0.hit + 0x54);
                                  iVar41 = *(int *)(local_6c0.hit + 0x58);
                                  iVar42 = *(int *)(local_6c0.hit + 0x5c);
                                  iVar43 = *(int *)(local_6c0.hit + 0x60);
                                  iVar44 = *(int *)(local_6c0.hit + 100);
                                  iVar45 = *(int *)(local_6c0.hit + 0x68);
                                  iVar46 = *(int *)(local_6c0.hit + 0x6c);
                                  iVar47 = *(int *)(local_6c0.hit + 0x70);
                                  iVar48 = *(int *)(local_6c0.hit + 0x74);
                                  iVar49 = *(int *)(local_6c0.hit + 0x78);
                                  iVar50 = *(int *)(local_6c0.hit + 0x7c);
                                  bVar30 = (bool)((byte)(uVar3 >> 1) & 1);
                                  bVar16 = (bool)((byte)(uVar3 >> 2) & 1);
                                  bVar17 = (bool)((byte)(uVar3 >> 3) & 1);
                                  bVar18 = (bool)((byte)(uVar3 >> 4) & 1);
                                  bVar19 = (bool)((byte)(uVar3 >> 5) & 1);
                                  bVar20 = (bool)((byte)(uVar3 >> 6) & 1);
                                  bVar21 = (bool)((byte)(uVar3 >> 7) & 1);
                                  bVar23 = (bool)((byte)(uVar3 >> 9) & 1);
                                  bVar24 = (bool)((byte)(uVar3 >> 10) & 1);
                                  bVar25 = (bool)((byte)(uVar3 >> 0xb) & 1);
                                  bVar26 = (bool)((byte)(uVar3 >> 0xc) & 1);
                                  bVar27 = (bool)((byte)(uVar3 >> 0xd) & 1);
                                  bVar28 = (bool)((byte)(uVar3 >> 0xe) & 1);
                                  bVar29 = SUB81(uVar3 >> 0xf,0);
                                  *(uint *)(local_6c0.ray + 0x340) =
                                       (uint)(bVar51 & 1) * *(int *)(local_6c0.hit + 0x40) |
                                       (uint)!(bool)(bVar51 & 1) * *(int *)(local_6c0.ray + 0x340);
                                  *(uint *)(local_6c0.ray + 0x344) =
                                       (uint)bVar30 * iVar128 |
                                       (uint)!bVar30 * *(int *)(local_6c0.ray + 0x344);
                                  *(uint *)(local_6c0.ray + 0x348) =
                                       (uint)bVar16 * iVar289 |
                                       (uint)!bVar16 * *(int *)(local_6c0.ray + 0x348);
                                  *(uint *)(local_6c0.ray + 0x34c) =
                                       (uint)bVar17 * iVar38 |
                                       (uint)!bVar17 * *(int *)(local_6c0.ray + 0x34c);
                                  *(uint *)(local_6c0.ray + 0x350) =
                                       (uint)bVar18 * iVar39 |
                                       (uint)!bVar18 * *(int *)(local_6c0.ray + 0x350);
                                  *(uint *)(local_6c0.ray + 0x354) =
                                       (uint)bVar19 * iVar40 |
                                       (uint)!bVar19 * *(int *)(local_6c0.ray + 0x354);
                                  *(uint *)(local_6c0.ray + 0x358) =
                                       (uint)bVar20 * iVar41 |
                                       (uint)!bVar20 * *(int *)(local_6c0.ray + 0x358);
                                  *(uint *)(local_6c0.ray + 0x35c) =
                                       (uint)bVar21 * iVar42 |
                                       (uint)!bVar21 * *(int *)(local_6c0.ray + 0x35c);
                                  *(uint *)(local_6c0.ray + 0x360) =
                                       (uint)(bVar22 & 1) * iVar43 |
                                       (uint)!(bool)(bVar22 & 1) * *(int *)(local_6c0.ray + 0x360);
                                  *(uint *)(local_6c0.ray + 0x364) =
                                       (uint)bVar23 * iVar44 |
                                       (uint)!bVar23 * *(int *)(local_6c0.ray + 0x364);
                                  *(uint *)(local_6c0.ray + 0x368) =
                                       (uint)bVar24 * iVar45 |
                                       (uint)!bVar24 * *(int *)(local_6c0.ray + 0x368);
                                  *(uint *)(local_6c0.ray + 0x36c) =
                                       (uint)bVar25 * iVar46 |
                                       (uint)!bVar25 * *(int *)(local_6c0.ray + 0x36c);
                                  *(uint *)(local_6c0.ray + 0x370) =
                                       (uint)bVar26 * iVar47 |
                                       (uint)!bVar26 * *(int *)(local_6c0.ray + 0x370);
                                  *(uint *)(local_6c0.ray + 0x374) =
                                       (uint)bVar27 * iVar48 |
                                       (uint)!bVar27 * *(int *)(local_6c0.ray + 0x374);
                                  *(uint *)(local_6c0.ray + 0x378) =
                                       (uint)bVar28 * iVar49 |
                                       (uint)!bVar28 * *(int *)(local_6c0.ray + 0x378);
                                  *(uint *)(local_6c0.ray + 0x37c) =
                                       (uint)bVar29 * iVar50 |
                                       (uint)!bVar29 * *(int *)(local_6c0.ray + 0x37c);
                                  iVar128 = *(int *)(local_6c0.hit + 0x84);
                                  iVar289 = *(int *)(local_6c0.hit + 0x88);
                                  iVar38 = *(int *)(local_6c0.hit + 0x8c);
                                  iVar39 = *(int *)(local_6c0.hit + 0x90);
                                  iVar40 = *(int *)(local_6c0.hit + 0x94);
                                  iVar41 = *(int *)(local_6c0.hit + 0x98);
                                  iVar42 = *(int *)(local_6c0.hit + 0x9c);
                                  iVar43 = *(int *)(local_6c0.hit + 0xa0);
                                  iVar44 = *(int *)(local_6c0.hit + 0xa4);
                                  iVar45 = *(int *)(local_6c0.hit + 0xa8);
                                  iVar46 = *(int *)(local_6c0.hit + 0xac);
                                  iVar47 = *(int *)(local_6c0.hit + 0xb0);
                                  iVar48 = *(int *)(local_6c0.hit + 0xb4);
                                  iVar49 = *(int *)(local_6c0.hit + 0xb8);
                                  iVar50 = *(int *)(local_6c0.hit + 0xbc);
                                  bVar30 = (bool)((byte)(uVar3 >> 1) & 1);
                                  bVar16 = (bool)((byte)(uVar3 >> 2) & 1);
                                  bVar17 = (bool)((byte)(uVar3 >> 3) & 1);
                                  bVar18 = (bool)((byte)(uVar3 >> 4) & 1);
                                  bVar19 = (bool)((byte)(uVar3 >> 5) & 1);
                                  bVar20 = (bool)((byte)(uVar3 >> 6) & 1);
                                  bVar21 = (bool)((byte)(uVar3 >> 7) & 1);
                                  bVar23 = (bool)((byte)(uVar3 >> 9) & 1);
                                  bVar24 = (bool)((byte)(uVar3 >> 10) & 1);
                                  bVar25 = (bool)((byte)(uVar3 >> 0xb) & 1);
                                  bVar26 = (bool)((byte)(uVar3 >> 0xc) & 1);
                                  bVar27 = (bool)((byte)(uVar3 >> 0xd) & 1);
                                  bVar28 = (bool)((byte)(uVar3 >> 0xe) & 1);
                                  bVar29 = SUB81(uVar3 >> 0xf,0);
                                  *(uint *)(local_6c0.ray + 0x380) =
                                       (uint)(bVar51 & 1) * *(int *)(local_6c0.hit + 0x80) |
                                       (uint)!(bool)(bVar51 & 1) * *(int *)(local_6c0.ray + 0x380);
                                  *(uint *)(local_6c0.ray + 900) =
                                       (uint)bVar30 * iVar128 |
                                       (uint)!bVar30 * *(int *)(local_6c0.ray + 900);
                                  *(uint *)(local_6c0.ray + 0x388) =
                                       (uint)bVar16 * iVar289 |
                                       (uint)!bVar16 * *(int *)(local_6c0.ray + 0x388);
                                  *(uint *)(local_6c0.ray + 0x38c) =
                                       (uint)bVar17 * iVar38 |
                                       (uint)!bVar17 * *(int *)(local_6c0.ray + 0x38c);
                                  *(uint *)(local_6c0.ray + 0x390) =
                                       (uint)bVar18 * iVar39 |
                                       (uint)!bVar18 * *(int *)(local_6c0.ray + 0x390);
                                  *(uint *)(local_6c0.ray + 0x394) =
                                       (uint)bVar19 * iVar40 |
                                       (uint)!bVar19 * *(int *)(local_6c0.ray + 0x394);
                                  *(uint *)(local_6c0.ray + 0x398) =
                                       (uint)bVar20 * iVar41 |
                                       (uint)!bVar20 * *(int *)(local_6c0.ray + 0x398);
                                  *(uint *)(local_6c0.ray + 0x39c) =
                                       (uint)bVar21 * iVar42 |
                                       (uint)!bVar21 * *(int *)(local_6c0.ray + 0x39c);
                                  *(uint *)(local_6c0.ray + 0x3a0) =
                                       (uint)(bVar22 & 1) * iVar43 |
                                       (uint)!(bool)(bVar22 & 1) * *(int *)(local_6c0.ray + 0x3a0);
                                  *(uint *)(local_6c0.ray + 0x3a4) =
                                       (uint)bVar23 * iVar44 |
                                       (uint)!bVar23 * *(int *)(local_6c0.ray + 0x3a4);
                                  *(uint *)(local_6c0.ray + 0x3a8) =
                                       (uint)bVar24 * iVar45 |
                                       (uint)!bVar24 * *(int *)(local_6c0.ray + 0x3a8);
                                  *(uint *)(local_6c0.ray + 0x3ac) =
                                       (uint)bVar25 * iVar46 |
                                       (uint)!bVar25 * *(int *)(local_6c0.ray + 0x3ac);
                                  *(uint *)(local_6c0.ray + 0x3b0) =
                                       (uint)bVar26 * iVar47 |
                                       (uint)!bVar26 * *(int *)(local_6c0.ray + 0x3b0);
                                  *(uint *)(local_6c0.ray + 0x3b4) =
                                       (uint)bVar27 * iVar48 |
                                       (uint)!bVar27 * *(int *)(local_6c0.ray + 0x3b4);
                                  *(uint *)(local_6c0.ray + 0x3b8) =
                                       (uint)bVar28 * iVar49 |
                                       (uint)!bVar28 * *(int *)(local_6c0.ray + 0x3b8);
                                  *(uint *)(local_6c0.ray + 0x3bc) =
                                       (uint)bVar29 * iVar50 |
                                       (uint)!bVar29 * *(int *)(local_6c0.ray + 0x3bc);
                                  iVar128 = *(int *)(local_6c0.hit + 0xc4);
                                  iVar289 = *(int *)(local_6c0.hit + 200);
                                  iVar38 = *(int *)(local_6c0.hit + 0xcc);
                                  iVar39 = *(int *)(local_6c0.hit + 0xd0);
                                  iVar40 = *(int *)(local_6c0.hit + 0xd4);
                                  iVar41 = *(int *)(local_6c0.hit + 0xd8);
                                  iVar42 = *(int *)(local_6c0.hit + 0xdc);
                                  iVar43 = *(int *)(local_6c0.hit + 0xe0);
                                  iVar44 = *(int *)(local_6c0.hit + 0xe4);
                                  iVar45 = *(int *)(local_6c0.hit + 0xe8);
                                  iVar46 = *(int *)(local_6c0.hit + 0xec);
                                  iVar47 = *(int *)(local_6c0.hit + 0xf0);
                                  iVar48 = *(int *)(local_6c0.hit + 0xf4);
                                  iVar49 = *(int *)(local_6c0.hit + 0xf8);
                                  iVar50 = *(int *)(local_6c0.hit + 0xfc);
                                  bVar30 = (bool)((byte)(uVar3 >> 1) & 1);
                                  bVar16 = (bool)((byte)(uVar3 >> 2) & 1);
                                  bVar17 = (bool)((byte)(uVar3 >> 3) & 1);
                                  bVar18 = (bool)((byte)(uVar3 >> 4) & 1);
                                  bVar19 = (bool)((byte)(uVar3 >> 5) & 1);
                                  bVar20 = (bool)((byte)(uVar3 >> 6) & 1);
                                  bVar21 = (bool)((byte)(uVar3 >> 7) & 1);
                                  bVar23 = (bool)((byte)(uVar3 >> 9) & 1);
                                  bVar24 = (bool)((byte)(uVar3 >> 10) & 1);
                                  bVar25 = (bool)((byte)(uVar3 >> 0xb) & 1);
                                  bVar26 = (bool)((byte)(uVar3 >> 0xc) & 1);
                                  bVar27 = (bool)((byte)(uVar3 >> 0xd) & 1);
                                  bVar28 = (bool)((byte)(uVar3 >> 0xe) & 1);
                                  bVar29 = SUB81(uVar3 >> 0xf,0);
                                  *(uint *)(local_6c0.ray + 0x3c0) =
                                       (uint)(bVar51 & 1) * *(int *)(local_6c0.hit + 0xc0) |
                                       (uint)!(bool)(bVar51 & 1) * *(int *)(local_6c0.ray + 0x3c0);
                                  *(uint *)(local_6c0.ray + 0x3c4) =
                                       (uint)bVar30 * iVar128 |
                                       (uint)!bVar30 * *(int *)(local_6c0.ray + 0x3c4);
                                  *(uint *)(local_6c0.ray + 0x3c8) =
                                       (uint)bVar16 * iVar289 |
                                       (uint)!bVar16 * *(int *)(local_6c0.ray + 0x3c8);
                                  *(uint *)(local_6c0.ray + 0x3cc) =
                                       (uint)bVar17 * iVar38 |
                                       (uint)!bVar17 * *(int *)(local_6c0.ray + 0x3cc);
                                  *(uint *)(local_6c0.ray + 0x3d0) =
                                       (uint)bVar18 * iVar39 |
                                       (uint)!bVar18 * *(int *)(local_6c0.ray + 0x3d0);
                                  *(uint *)(local_6c0.ray + 0x3d4) =
                                       (uint)bVar19 * iVar40 |
                                       (uint)!bVar19 * *(int *)(local_6c0.ray + 0x3d4);
                                  *(uint *)(local_6c0.ray + 0x3d8) =
                                       (uint)bVar20 * iVar41 |
                                       (uint)!bVar20 * *(int *)(local_6c0.ray + 0x3d8);
                                  *(uint *)(local_6c0.ray + 0x3dc) =
                                       (uint)bVar21 * iVar42 |
                                       (uint)!bVar21 * *(int *)(local_6c0.ray + 0x3dc);
                                  *(uint *)(local_6c0.ray + 0x3e0) =
                                       (uint)(bVar22 & 1) * iVar43 |
                                       (uint)!(bool)(bVar22 & 1) * *(int *)(local_6c0.ray + 0x3e0);
                                  *(uint *)(local_6c0.ray + 0x3e4) =
                                       (uint)bVar23 * iVar44 |
                                       (uint)!bVar23 * *(int *)(local_6c0.ray + 0x3e4);
                                  *(uint *)(local_6c0.ray + 1000) =
                                       (uint)bVar24 * iVar45 |
                                       (uint)!bVar24 * *(int *)(local_6c0.ray + 1000);
                                  *(uint *)(local_6c0.ray + 0x3ec) =
                                       (uint)bVar25 * iVar46 |
                                       (uint)!bVar25 * *(int *)(local_6c0.ray + 0x3ec);
                                  *(uint *)(local_6c0.ray + 0x3f0) =
                                       (uint)bVar26 * iVar47 |
                                       (uint)!bVar26 * *(int *)(local_6c0.ray + 0x3f0);
                                  *(uint *)(local_6c0.ray + 0x3f4) =
                                       (uint)bVar27 * iVar48 |
                                       (uint)!bVar27 * *(int *)(local_6c0.ray + 0x3f4);
                                  *(uint *)(local_6c0.ray + 0x3f8) =
                                       (uint)bVar28 * iVar49 |
                                       (uint)!bVar28 * *(int *)(local_6c0.ray + 0x3f8);
                                  *(uint *)(local_6c0.ray + 0x3fc) =
                                       (uint)bVar29 * iVar50 |
                                       (uint)!bVar29 * *(int *)(local_6c0.ray + 0x3fc);
                                  iVar128 = *(int *)(local_6c0.hit + 0x104);
                                  iVar289 = *(int *)(local_6c0.hit + 0x108);
                                  iVar38 = *(int *)(local_6c0.hit + 0x10c);
                                  iVar39 = *(int *)(local_6c0.hit + 0x110);
                                  iVar40 = *(int *)(local_6c0.hit + 0x114);
                                  iVar41 = *(int *)(local_6c0.hit + 0x118);
                                  iVar42 = *(int *)(local_6c0.hit + 0x11c);
                                  iVar43 = *(int *)(local_6c0.hit + 0x120);
                                  iVar44 = *(int *)(local_6c0.hit + 0x124);
                                  iVar45 = *(int *)(local_6c0.hit + 0x128);
                                  iVar46 = *(int *)(local_6c0.hit + 300);
                                  iVar47 = *(int *)(local_6c0.hit + 0x130);
                                  iVar48 = *(int *)(local_6c0.hit + 0x134);
                                  iVar49 = *(int *)(local_6c0.hit + 0x138);
                                  iVar50 = *(int *)(local_6c0.hit + 0x13c);
                                  bVar30 = (bool)((byte)(uVar3 >> 1) & 1);
                                  bVar16 = (bool)((byte)(uVar3 >> 2) & 1);
                                  bVar17 = (bool)((byte)(uVar3 >> 3) & 1);
                                  bVar18 = (bool)((byte)(uVar3 >> 4) & 1);
                                  bVar19 = (bool)((byte)(uVar3 >> 5) & 1);
                                  bVar20 = (bool)((byte)(uVar3 >> 6) & 1);
                                  bVar21 = (bool)((byte)(uVar3 >> 7) & 1);
                                  bVar23 = (bool)((byte)(uVar3 >> 9) & 1);
                                  bVar24 = (bool)((byte)(uVar3 >> 10) & 1);
                                  bVar25 = (bool)((byte)(uVar3 >> 0xb) & 1);
                                  bVar26 = (bool)((byte)(uVar3 >> 0xc) & 1);
                                  bVar27 = (bool)((byte)(uVar3 >> 0xd) & 1);
                                  bVar28 = (bool)((byte)(uVar3 >> 0xe) & 1);
                                  bVar29 = SUB81(uVar3 >> 0xf,0);
                                  *(uint *)(local_6c0.ray + 0x400) =
                                       (uint)(bVar51 & 1) * *(int *)(local_6c0.hit + 0x100) |
                                       (uint)!(bool)(bVar51 & 1) * *(int *)(local_6c0.ray + 0x400);
                                  *(uint *)(local_6c0.ray + 0x404) =
                                       (uint)bVar30 * iVar128 |
                                       (uint)!bVar30 * *(int *)(local_6c0.ray + 0x404);
                                  *(uint *)(local_6c0.ray + 0x408) =
                                       (uint)bVar16 * iVar289 |
                                       (uint)!bVar16 * *(int *)(local_6c0.ray + 0x408);
                                  *(uint *)(local_6c0.ray + 0x40c) =
                                       (uint)bVar17 * iVar38 |
                                       (uint)!bVar17 * *(int *)(local_6c0.ray + 0x40c);
                                  *(uint *)(local_6c0.ray + 0x410) =
                                       (uint)bVar18 * iVar39 |
                                       (uint)!bVar18 * *(int *)(local_6c0.ray + 0x410);
                                  *(uint *)(local_6c0.ray + 0x414) =
                                       (uint)bVar19 * iVar40 |
                                       (uint)!bVar19 * *(int *)(local_6c0.ray + 0x414);
                                  *(uint *)(local_6c0.ray + 0x418) =
                                       (uint)bVar20 * iVar41 |
                                       (uint)!bVar20 * *(int *)(local_6c0.ray + 0x418);
                                  *(uint *)(local_6c0.ray + 0x41c) =
                                       (uint)bVar21 * iVar42 |
                                       (uint)!bVar21 * *(int *)(local_6c0.ray + 0x41c);
                                  *(uint *)(local_6c0.ray + 0x420) =
                                       (uint)(bVar22 & 1) * iVar43 |
                                       (uint)!(bool)(bVar22 & 1) * *(int *)(local_6c0.ray + 0x420);
                                  *(uint *)(local_6c0.ray + 0x424) =
                                       (uint)bVar23 * iVar44 |
                                       (uint)!bVar23 * *(int *)(local_6c0.ray + 0x424);
                                  *(uint *)(local_6c0.ray + 0x428) =
                                       (uint)bVar24 * iVar45 |
                                       (uint)!bVar24 * *(int *)(local_6c0.ray + 0x428);
                                  *(uint *)(local_6c0.ray + 0x42c) =
                                       (uint)bVar25 * iVar46 |
                                       (uint)!bVar25 * *(int *)(local_6c0.ray + 0x42c);
                                  *(uint *)(local_6c0.ray + 0x430) =
                                       (uint)bVar26 * iVar47 |
                                       (uint)!bVar26 * *(int *)(local_6c0.ray + 0x430);
                                  *(uint *)(local_6c0.ray + 0x434) =
                                       (uint)bVar27 * iVar48 |
                                       (uint)!bVar27 * *(int *)(local_6c0.ray + 0x434);
                                  *(uint *)(local_6c0.ray + 0x438) =
                                       (uint)bVar28 * iVar49 |
                                       (uint)!bVar28 * *(int *)(local_6c0.ray + 0x438);
                                  *(uint *)(local_6c0.ray + 0x43c) =
                                       (uint)bVar29 * iVar50 |
                                       (uint)!bVar29 * *(int *)(local_6c0.ray + 0x43c);
                                  auVar111 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                                (local_6c0.hit + 0x140));
                                  auVar111 = vmovdqu32_avx512f(auVar111);
                                  *(undefined1 (*) [64])(local_6c0.ray + 0x440) = auVar111;
                                  auVar111 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                                (local_6c0.hit + 0x180));
                                  auVar111 = vmovdqu32_avx512f(auVar111);
                                  *(undefined1 (*) [64])(local_6c0.ray + 0x480) = auVar111;
                                  auVar287 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                                (local_6c0.hit + 0x1c0));
                                  auVar111 = vmovdqa32_avx512f(auVar287);
                                  *(undefined1 (*) [64])(local_6c0.ray + 0x4c0) = auVar111;
                                  auVar111 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                                (local_6c0.hit + 0x200));
                                  bVar30 = (bool)((byte)(uVar3 >> 1) & 1);
                                  auVar37._4_56_ = auVar111._8_56_;
                                  auVar37._0_4_ =
                                       (uint)bVar30 * auVar111._4_4_ |
                                       (uint)!bVar30 * auVar287._4_4_;
                                  auVar126._0_8_ = auVar37._0_8_ << 0x20;
                                  bVar30 = (bool)((byte)(uVar3 >> 2) & 1);
                                  auVar126._8_4_ =
                                       (uint)bVar30 * auVar111._8_4_ |
                                       (uint)!bVar30 * auVar287._8_4_;
                                  bVar30 = (bool)((byte)(uVar3 >> 3) & 1);
                                  auVar126._12_4_ =
                                       (uint)bVar30 * auVar111._12_4_ |
                                       (uint)!bVar30 * auVar287._12_4_;
                                  bVar30 = (bool)((byte)(uVar3 >> 4) & 1);
                                  auVar126._16_4_ =
                                       (uint)bVar30 * auVar111._16_4_ |
                                       (uint)!bVar30 * auVar287._16_4_;
                                  bVar30 = (bool)((byte)(uVar3 >> 5) & 1);
                                  auVar126._20_4_ =
                                       (uint)bVar30 * auVar111._20_4_ |
                                       (uint)!bVar30 * auVar287._20_4_;
                                  bVar30 = (bool)((byte)(uVar3 >> 6) & 1);
                                  auVar126._24_4_ =
                                       (uint)bVar30 * auVar111._24_4_ |
                                       (uint)!bVar30 * auVar287._24_4_;
                                  bVar30 = (bool)((byte)(uVar3 >> 7) & 1);
                                  auVar126._28_4_ =
                                       (uint)bVar30 * auVar111._28_4_ |
                                       (uint)!bVar30 * auVar287._28_4_;
                                  auVar126._32_4_ =
                                       (uint)(bVar22 & 1) * auVar111._32_4_ |
                                       (uint)!(bool)(bVar22 & 1) * auVar287._32_4_;
                                  bVar30 = (bool)((byte)(uVar3 >> 9) & 1);
                                  auVar126._36_4_ =
                                       (uint)bVar30 * auVar111._36_4_ |
                                       (uint)!bVar30 * auVar287._36_4_;
                                  bVar30 = (bool)((byte)(uVar3 >> 10) & 1);
                                  auVar126._40_4_ =
                                       (uint)bVar30 * auVar111._40_4_ |
                                       (uint)!bVar30 * auVar287._40_4_;
                                  bVar30 = (bool)((byte)(uVar3 >> 0xb) & 1);
                                  auVar126._44_4_ =
                                       (uint)bVar30 * auVar111._44_4_ |
                                       (uint)!bVar30 * auVar287._44_4_;
                                  bVar30 = (bool)((byte)(uVar3 >> 0xc) & 1);
                                  auVar126._48_4_ =
                                       (uint)bVar30 * auVar111._48_4_ |
                                       (uint)!bVar30 * auVar287._48_4_;
                                  bVar30 = (bool)((byte)(uVar3 >> 0xd) & 1);
                                  auVar126._52_4_ =
                                       (uint)bVar30 * auVar111._52_4_ |
                                       (uint)!bVar30 * auVar287._52_4_;
                                  bVar30 = (bool)((byte)(uVar3 >> 0xe) & 1);
                                  auVar126._56_4_ =
                                       (uint)bVar30 * auVar111._56_4_ |
                                       (uint)!bVar30 * auVar287._56_4_;
                                  bVar30 = SUB81(uVar3 >> 0xf,0);
                                  auVar126._60_4_ =
                                       (uint)bVar30 * auVar111._60_4_ |
                                       (uint)!bVar30 * auVar287._60_4_;
                                  auVar127 = auVar126._16_48_;
                                  auVar111 = vmovdqa32_avx512f(auVar111);
                                  *(undefined1 (*) [64])(local_6c0.ray + 0x500) = auVar111;
                                }
                                auVar62 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                auVar287 = ZEXT1664(auVar62);
                                auVar111._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                auVar111._16_48_ = auVar127;
                                auVar135 = ZEXT1664(auVar111._0_16_);
                              }
                              auVar284 = ZEXT1664(auVar76);
                            }
                          }
                        }
                      }
                    }
                  }
                  break;
                }
                lVar56 = lVar56 + -1;
              } while (lVar56 != 0);
            }
          }
          else {
            auVar287 = ZEXT1664(auVar146);
            auVar111._0_16_ = auVar74;
          }
        }
      }
      auVar112._32_32_ = auVar111._32_32_;
    } while (bVar15);
    auVar62 = vinsertps_avx512f(auVar125._0_16_,auVar79,0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }